

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::dynamicCheckTestMessage<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  bool bVar1;
  BuilderFor<float> BVar2;
  BuilderFor<double> BVar3;
  ArrayPtr<unsigned_char> AVar4;
  BuilderFor<capnp::DynamicEnum> BVar5;
  ArrayPtr<const_char> AVar6;
  Reader RVar7;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  initializer_list<capnp::Void> expected;
  initializer_list<bool> expected_00;
  initializer_list<signed_char> expected_01;
  initializer_list<short> expected_02;
  initializer_list<int> expected_03;
  initializer_list<long> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<unsigned_short> expected_06;
  initializer_list<unsigned_int> expected_07;
  initializer_list<unsigned_long> expected_08;
  initializer_list<float> expected_09;
  initializer_list<double> expected_10;
  initializer_list<capnp::Text::Reader> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<const_char_*> expected_13;
  initializer_list<bool> expected_14;
  initializer_list<signed_char> expected_15;
  initializer_list<short> expected_16;
  initializer_list<int> expected_17;
  initializer_list<long> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<unsigned_short> expected_20;
  initializer_list<unsigned_int> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<capnp::Text::Reader> expected_23;
  initializer_list<capnp::Data::Reader> expected_24;
  initializer_list<const_char_*> expected_25;
  char *local_41d0;
  undefined1 local_41c8 [40];
  Builder local_41a0;
  ArrayPtr<const_char> local_4160;
  Builder local_4150;
  BuilderFor<capnp::DynamicStruct> local_4110;
  Builder local_40e0;
  BuilderFor<capnp::Text> local_40a0;
  bool local_4081;
  undefined1 auStack_4080 [7];
  bool _kj_shouldLog_46;
  Builder local_4070;
  BuilderFor<capnp::DynamicStruct> local_4030;
  Builder local_4000;
  BuilderFor<capnp::Text> local_3fc0;
  char (*local_3fa8) [13];
  undefined1 local_3fa0 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Builder> _kjCondition_50;
  Builder local_3f58;
  BuilderFor<capnp::DynamicStruct> local_3f18;
  Builder local_3ee8;
  BuilderFor<capnp::Text> local_3ea8;
  bool local_3e89;
  undefined1 auStack_3e88 [7];
  bool _kj_shouldLog_45;
  Builder local_3e78;
  BuilderFor<capnp::DynamicStruct> local_3e38;
  Builder local_3e08;
  BuilderFor<capnp::Text> local_3dc8;
  char (*local_3db0) [13];
  undefined1 local_3da8 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Builder> _kjCondition_49;
  Builder local_3d60;
  BuilderFor<capnp::DynamicStruct> local_3d20;
  Builder local_3cf0;
  BuilderFor<capnp::Text> local_3cb0;
  bool local_3c91;
  undefined1 auStack_3c90 [7];
  bool _kj_shouldLog_44;
  Builder local_3c80;
  BuilderFor<capnp::DynamicStruct> local_3c40;
  Builder local_3c10;
  BuilderFor<capnp::Text> local_3bd0;
  char (*local_3bb8) [13];
  undefined1 local_3bb0 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Builder> _kjCondition_48;
  Fault local_3b70;
  Fault f_3;
  uint local_3b60;
  DebugExpression<unsigned_int> local_3b5c;
  undefined1 local_3b58 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_47;
  Builder local_3b28;
  undefined1 local_3ae8 [8];
  BuilderFor<capnp::DynamicList> listReader_3;
  ArrayPtr<const_char> local_3a70;
  Builder local_3a60;
  undefined1 local_3a20 [32];
  Reader local_3a00 [2];
  StringPtr local_39e0;
  Builder local_39d0;
  bool local_3989;
  undefined1 local_3988 [7];
  bool _kj_shouldLog_43;
  bool local_3942;
  DebugExpression<bool> local_3941;
  undefined1 local_3940 [7];
  DebugExpression<bool> _kjCondition_46;
  BuilderFor<double> local_3900;
  float local_38f8;
  bool local_38f1;
  undefined1 local_38f0 [7];
  bool _kj_shouldLog_42;
  BuilderFor<double> local_38b0;
  float local_38a8;
  DebugExpression<float> local_38a4;
  undefined1 local_38a0 [8];
  DebugComparison<float,_double> _kjCondition_45;
  BuilderFor<double> local_3838;
  float local_3830;
  bool local_3829;
  undefined1 local_3828 [7];
  bool _kj_shouldLog_41;
  BuilderFor<double> local_37e8;
  float local_37e0;
  DebugExpression<float> local_37dc;
  undefined1 local_37d8 [8];
  DebugComparison<float,_double> _kjCondition_44;
  BuilderFor<double> local_3770;
  double local_3768;
  bool local_3759;
  undefined1 local_3758 [7];
  bool _kj_shouldLog_40;
  BuilderFor<double> local_3718;
  double local_3710;
  DebugExpression<double> local_3708;
  undefined1 local_3700 [8];
  DebugComparison<double,_double> _kjCondition_43;
  Fault local_36d0;
  Fault f_2;
  uint local_36c0;
  DebugExpression<unsigned_int> local_36bc;
  undefined1 local_36b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_42;
  Builder local_3688;
  undefined1 local_3648 [8];
  BuilderFor<capnp::DynamicList> listReader_2;
  undefined1 local_3608 [7];
  bool _kj_shouldLog_39;
  bool local_35c2;
  DebugExpression<bool> local_35c1;
  undefined1 local_35c0 [7];
  DebugExpression<bool> _kjCondition_41;
  BuilderFor<float> local_357c;
  float local_3578;
  bool local_3571;
  undefined1 local_3570 [7];
  bool _kj_shouldLog_38;
  BuilderFor<float> local_352c;
  float local_3528;
  DebugExpression<float> local_3524;
  undefined1 local_3520 [8];
  DebugComparison<float,_float> _kjCondition_40;
  BuilderFor<float> local_34bc;
  float local_34b8;
  bool local_34b1;
  undefined1 local_34b0 [7];
  bool _kj_shouldLog_37;
  BuilderFor<float> local_346c;
  float local_3468;
  DebugExpression<float> local_3464;
  undefined1 local_3460 [8];
  DebugComparison<float,_float> _kjCondition_39;
  BuilderFor<float> local_33fc;
  float local_33f8;
  bool local_33f1;
  undefined1 local_33f0 [7];
  bool _kj_shouldLog_36;
  BuilderFor<float> local_33ac;
  float local_33a8;
  DebugExpression<float> local_33a4;
  undefined1 local_33a0 [8];
  DebugComparison<float,_float> _kjCondition_38;
  Fault local_3378;
  Fault f_1;
  uint local_3368;
  DebugExpression<unsigned_int> local_3364;
  undefined1 local_3360 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_37;
  Builder local_3330;
  undefined1 local_32f0 [8];
  BuilderFor<capnp::DynamicList> listReader_1;
  StringPtr local_32a0;
  Builder local_3290;
  undefined1 local_324c [20];
  StringPtr local_3238;
  Builder local_3228;
  undefined1 local_31e4 [20];
  StringPtr local_31d0;
  Builder local_31c0;
  undefined1 local_317a [18];
  StringPtr local_3168;
  Builder local_3158;
  undefined1 local_3118 [48];
  Builder local_30e8;
  undefined1 local_30a8 [40];
  Builder local_3080;
  undefined1 local_303c [20];
  StringPtr local_3028;
  Builder local_3018;
  undefined1 local_2fd2 [18];
  StringPtr local_2fc0;
  Builder local_2fb0;
  undefined1 local_2f6c [20];
  StringPtr local_2f58;
  Builder local_2f48;
  ArrayPtr<const_char> local_2f08;
  Builder local_2ef8;
  BuilderFor<capnp::DynamicList> local_2eb8;
  uint local_2e7c;
  uint local_2e78;
  bool local_2e71;
  undefined1 auStack_2e70 [7];
  bool _kj_shouldLog_35;
  Builder local_2e60;
  BuilderFor<capnp::DynamicList> local_2e20;
  uint local_2de4;
  uint local_2de0;
  DebugExpression<unsigned_int> local_2ddc;
  undefined1 local_2dd8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_36;
  ArrayPtr<const_char> local_2da8;
  Builder local_2d98;
  Schema local_2d58;
  uint local_2d50;
  ArrayPtr<const_char> local_2d48;
  bool local_2d31;
  Schema SStack_2d30;
  bool _kj_shouldLog_34;
  uint16_t local_2d28;
  ArrayPtr<const_char> local_2d20;
  Builder local_2d10;
  Schema local_2cd0;
  uint local_2cc8;
  ArrayPtr<const_char> local_2cc0;
  char (*local_2cb0) [6];
  undefined1 local_2ca8 [8];
  DebugComparison<const_char_(&)[6],_capnp::Text::Reader> _kjCondition_35;
  StringPtr local_2c48;
  Builder local_2c38;
  ArrayPtr<const_char> local_2bf8;
  Builder local_2be8;
  BuilderFor<capnp::DynamicStruct> local_2ba8;
  Builder local_2b78;
  BuilderFor<capnp::Text> local_2b38;
  bool local_2b19;
  undefined1 auStack_2b18 [7];
  bool _kj_shouldLog_33;
  Builder local_2b08;
  BuilderFor<capnp::DynamicStruct> local_2ac8;
  Builder local_2a98;
  BuilderFor<capnp::Text> local_2a58;
  char (*local_2a40) [15];
  undefined1 local_2a38 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Builder> _kjCondition_34;
  Builder local_29f0;
  BuilderFor<capnp::DynamicStruct> local_29b0;
  Builder local_2980;
  BuilderFor<capnp::Text> local_2940;
  bool local_2921;
  undefined1 auStack_2920 [7];
  bool _kj_shouldLog_32;
  Builder local_2910;
  BuilderFor<capnp::DynamicStruct> local_28d0;
  Builder local_28a0;
  BuilderFor<capnp::Text> local_2860;
  char (*local_2848) [15];
  undefined1 local_2840 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Builder> _kjCondition_33;
  Builder local_27f8;
  BuilderFor<capnp::DynamicStruct> local_27b8;
  Builder local_2788;
  BuilderFor<capnp::Text> local_2748;
  bool local_2729;
  undefined1 auStack_2728 [7];
  bool _kj_shouldLog_31;
  Builder local_2718;
  BuilderFor<capnp::DynamicStruct> local_26d8;
  Builder local_26a8;
  BuilderFor<capnp::Text> local_2668;
  char (*local_2650) [15];
  undefined1 local_2648 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Builder> _kjCondition_32;
  Fault local_2608;
  Fault f;
  uint local_25f8;
  DebugExpression<unsigned_int> local_25f4;
  undefined1 local_25f0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  Builder local_25c0;
  undefined1 local_2580 [8];
  BuilderFor<capnp::DynamicList> listReader;
  ArrayPtr<const_char> local_2508;
  Builder local_24f8;
  undefined1 local_24b8 [32];
  Reader local_2498 [2];
  StringPtr local_2478;
  Builder local_2468;
  Builder local_2428;
  StringPtr local_23e8;
  Builder local_23d8;
  undefined1 local_2398 [64];
  Builder local_2358;
  undefined1 local_2318 [64];
  Builder local_22d8;
  undefined1 local_2298 [48];
  Builder local_2268;
  undefined1 local_2228 [40];
  Builder local_2200;
  undefined1 local_21bc [20];
  StringPtr local_21a8;
  Builder local_2198;
  undefined1 local_2158 [64];
  size_t local_2118;
  Builder local_2110;
  undefined1 local_20d0 [48];
  Builder local_20a0;
  undefined1 local_2060 [40];
  Builder local_2038;
  undefined1 local_1ff4 [20];
  StringPtr local_1fe0;
  Builder local_1fd0;
  undefined1 local_1f8d [21];
  StringPtr local_1f78;
  Builder local_1f68;
  undefined1 local_1f23 [19];
  StringPtr local_1f10;
  Builder local_1f00;
  Schema local_1ec0;
  uint16_t local_1eb8;
  ArrayPtr<const_char> local_1eb0;
  Builder local_1ea0;
  Schema local_1e60;
  uint local_1e58;
  ArrayPtr<const_char> local_1e50;
  bool local_1e39;
  Schema SStack_1e38;
  bool _kj_shouldLog_30;
  uint16_t local_1e30;
  ArrayPtr<const_char> local_1e28;
  Builder local_1e18;
  Schema local_1dd8;
  uint local_1dd0;
  ArrayPtr<const_char> local_1dc8;
  char (*local_1db8) [4];
  undefined1 local_1db0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_30;
  ArrayPtr<const_char> local_1d70;
  Builder local_1d60;
  BuilderFor<capnp::DynamicStruct> local_1d20;
  Builder local_1cf0;
  BuilderFor<capnp::Text> local_1cb0;
  bool local_1c91;
  undefined1 auStack_1c90 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_1c80;
  Builder local_1c70;
  BuilderFor<capnp::DynamicStruct> local_1c30;
  Builder local_1c00;
  BuilderFor<capnp::Text> local_1bc0;
  char (*local_1ba8) [14];
  undefined1 local_1ba0 [8];
  DebugComparison<const_char_(&)[14],_capnp::Text::Builder> _kjCondition_29;
  Builder local_1b58;
  BuilderFor<capnp::Text> local_1b18;
  bool local_1af9;
  undefined1 auStack_1af8 [7];
  bool _kj_shouldLog_28;
  Builder local_1ae8;
  BuilderFor<capnp::Text> local_1aa8;
  char (*local_1a90) [7];
  undefined1 local_1a88 [8];
  DebugComparison<const_char_(&)[7],_capnp::Text::Builder> _kjCondition_28;
  Builder local_1a40;
  undefined1 local_1a00 [8];
  BuilderFor<capnp::DynamicStruct> subSubReader;
  Builder local_19c0;
  ArrayPtr<unsigned_char> local_1980;
  ArrayPtr<const_unsigned_char> local_1970;
  bool local_1959;
  undefined1 auStack_1958 [7];
  bool _kj_shouldLog_27;
  Builder local_1948;
  ArrayPtr<unsigned_char> local_1908;
  ArrayPtr<const_unsigned_char> local_18f8;
  ArrayPtr<const_unsigned_char> local_18e8;
  undefined1 local_18d8 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_27;
  Builder local_1890;
  BuilderFor<capnp::Text> local_1850;
  bool local_1831;
  undefined1 auStack_1830 [7];
  bool _kj_shouldLog_26;
  Builder local_1820;
  BuilderFor<capnp::Text> local_17e0;
  char (*local_17c8) [4];
  undefined1 local_17c0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_26;
  ArrayPtr<const_char> local_1780;
  Builder local_1770;
  BuilderFor<double> local_1730;
  bool local_1721;
  undefined1 auStack_1720 [7];
  bool _kj_shouldLog_25;
  Builder local_1710;
  bool local_16ce;
  DebugExpression<bool> local_16cd;
  float local_16cc;
  undefined1 auStack_16c8 [3];
  DebugExpression<bool> _kjCondition_25;
  Builder local_16b8;
  BuilderFor<float> local_1678;
  bool local_1671;
  undefined1 auStack_1670 [7];
  bool _kj_shouldLog_24;
  Builder local_1660;
  bool local_161a;
  DebugExpression<bool> local_1619;
  undefined1 auStack_1618 [7];
  DebugExpression<bool> _kjCondition_24;
  Builder local_1608;
  BuilderFor<unsigned_long> local_15c8;
  unsigned_long_long local_15c0;
  bool local_15b1;
  undefined1 auStack_15b0 [7];
  bool _kj_shouldLog_23;
  Builder local_15a0;
  BuilderFor<unsigned_long> local_1560;
  unsigned_long_long local_1558;
  DebugExpression<unsigned_long_long> local_1550;
  undefined1 local_1548 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_23;
  Builder local_1510;
  BuilderFor<unsigned_int> local_14cc;
  uint local_14c8;
  bool local_14c1;
  undefined1 auStack_14c0 [7];
  bool _kj_shouldLog_22;
  Builder local_14b0;
  BuilderFor<unsigned_int> local_146c;
  uint local_1468;
  DebugExpression<unsigned_int> local_1464;
  undefined1 local_1460 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_22;
  Builder local_1430;
  BuilderFor<unsigned_short> local_13ea;
  uint local_13e8;
  bool local_13e1;
  undefined1 auStack_13e0 [7];
  bool _kj_shouldLog_21;
  Builder local_13d0;
  BuilderFor<unsigned_short> local_138a;
  uint local_1388;
  DebugExpression<unsigned_int> local_1384;
  undefined1 local_1380 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_21;
  Builder local_1350;
  BuilderFor<unsigned_char> local_1309;
  uint local_1308;
  bool local_1301;
  undefined1 auStack_1300 [7];
  bool _kj_shouldLog_20;
  Builder local_12f0;
  BuilderFor<unsigned_char> local_12a9;
  uint local_12a8;
  DebugExpression<unsigned_int> local_12a4;
  undefined1 local_12a0 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_20;
  Builder local_1270;
  BuilderFor<long> local_1230;
  longlong local_1228;
  bool local_1219;
  undefined1 auStack_1218 [7];
  bool _kj_shouldLog_19;
  Builder local_1208;
  BuilderFor<long> local_11c8;
  longlong local_11c0;
  DebugExpression<long_long> local_11b8;
  undefined1 local_11b0 [8];
  DebugComparison<long_long,_long> _kjCondition_19;
  Builder local_1178;
  BuilderFor<int> local_1134;
  int local_1130;
  bool local_1129;
  undefined1 auStack_1128 [7];
  bool _kj_shouldLog_18;
  Builder local_1118;
  BuilderFor<int> local_10d4;
  int local_10d0;
  DebugExpression<int> local_10cc;
  undefined1 local_10c8 [8];
  DebugComparison<int,_int> _kjCondition_18;
  Builder local_1098;
  BuilderFor<short> local_1052;
  int local_1050;
  bool local_1049;
  undefined1 auStack_1048 [7];
  bool _kj_shouldLog_17;
  Builder local_1038;
  BuilderFor<short> local_ff2;
  int local_ff0;
  DebugExpression<int> local_fec;
  undefined1 local_fe8 [8];
  DebugComparison<int,_short> _kjCondition_17;
  Builder local_fb8;
  BuilderFor<signed_char> local_f71;
  int local_f70;
  bool local_f69;
  undefined1 auStack_f68 [7];
  bool _kj_shouldLog_16;
  Builder local_f58;
  BuilderFor<signed_char> local_f11;
  int local_f10;
  DebugExpression<int> local_f0c;
  undefined1 local_f08 [8];
  DebugComparison<int,_signed_char> _kjCondition_16;
  Builder local_ed8;
  bool local_e93;
  bool local_e92;
  bool local_e91;
  undefined1 auStack_e90 [7];
  bool _kj_shouldLog_15;
  Builder local_e80;
  bool local_e3b;
  bool local_e3a;
  DebugExpression<bool> local_e39;
  undefined1 local_e38 [8];
  DebugComparison<bool,_bool> _kjCondition_15;
  ArrayPtr<const_char> local_e10;
  Builder local_e00;
  Void local_dbb;
  bool local_dba;
  undefined1 auStack_db8 [6];
  bool _kj_shouldLog_14;
  Builder local_da8;
  Void local_d61;
  Void *local_d60;
  undefined1 local_d58 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_14;
  Builder local_d20;
  undefined1 local_ce0 [8];
  BuilderFor<capnp::DynamicStruct> subReader;
  Builder local_ca0;
  ArrayPtr<unsigned_char> local_c60;
  ArrayPtr<const_unsigned_char> local_c50;
  bool local_c39;
  undefined1 auStack_c38 [7];
  bool _kj_shouldLog_13;
  Builder local_c28;
  ArrayPtr<unsigned_char> local_be8;
  ArrayPtr<const_unsigned_char> local_bd8;
  ArrayPtr<const_unsigned_char> local_bc8;
  undefined1 local_bb8 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_13;
  Builder local_b70;
  BuilderFor<capnp::Text> local_b30;
  bool local_b11;
  undefined1 auStack_b10 [7];
  bool _kj_shouldLog_12;
  Builder local_b00;
  BuilderFor<capnp::Text> local_ac0;
  char (*local_aa8) [4];
  undefined1 local_aa0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_12;
  ArrayPtr<const_char> local_a60;
  Builder local_a50;
  BuilderFor<double> local_a10;
  bool local_a01;
  undefined1 auStack_a00 [7];
  bool _kj_shouldLog_11;
  Builder local_9f0;
  bool local_9ae;
  DebugExpression<bool> local_9ad;
  float local_9ac;
  undefined1 auStack_9a8 [3];
  DebugExpression<bool> _kjCondition_11;
  Builder local_998;
  BuilderFor<float> local_958;
  bool local_951;
  undefined1 auStack_950 [7];
  bool _kj_shouldLog_10;
  Builder local_940;
  bool local_8fa;
  DebugExpression<bool> local_8f9;
  undefined1 auStack_8f8 [7];
  DebugExpression<bool> _kjCondition_10;
  Builder local_8e8;
  BuilderFor<unsigned_long> local_8a8;
  unsigned_long_long local_8a0;
  bool local_891;
  undefined1 auStack_890 [7];
  bool _kj_shouldLog_9;
  Builder local_880;
  BuilderFor<unsigned_long> local_840;
  unsigned_long_long local_838;
  DebugExpression<unsigned_long_long> local_830;
  undefined1 local_828 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_9;
  Builder local_7f0;
  BuilderFor<unsigned_int> local_7ac;
  uint local_7a8;
  bool local_7a1;
  undefined1 auStack_7a0 [7];
  bool _kj_shouldLog_8;
  Builder local_790;
  BuilderFor<unsigned_int> local_74c;
  uint local_748;
  DebugExpression<unsigned_int> local_744;
  undefined1 local_740 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  Builder local_710;
  BuilderFor<unsigned_short> local_6ca;
  uint local_6c8;
  bool local_6c1;
  undefined1 auStack_6c0 [7];
  bool _kj_shouldLog_7;
  Builder local_6b0;
  BuilderFor<unsigned_short> local_66a;
  uint local_668;
  DebugExpression<unsigned_int> local_664;
  undefined1 local_660 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_7;
  Builder local_630;
  BuilderFor<unsigned_char> local_5e9;
  uint local_5e8;
  bool local_5e1;
  undefined1 auStack_5e0 [7];
  bool _kj_shouldLog_6;
  Builder local_5d0;
  BuilderFor<unsigned_char> local_589;
  uint local_588;
  DebugExpression<unsigned_int> local_584;
  undefined1 local_580 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_6;
  Builder local_550;
  BuilderFor<long> local_510;
  longlong local_508;
  bool local_4f9;
  undefined1 auStack_4f8 [7];
  bool _kj_shouldLog_5;
  Builder local_4e8;
  BuilderFor<long> local_4a8;
  longlong local_4a0;
  DebugExpression<long_long> local_498;
  undefined1 local_490 [8];
  DebugComparison<long_long,_long> _kjCondition_5;
  Builder local_458;
  BuilderFor<int> local_414;
  int local_410;
  bool local_409;
  undefined1 auStack_408 [7];
  bool _kj_shouldLog_4;
  Builder local_3f8;
  BuilderFor<int> local_3b4;
  int local_3b0;
  DebugExpression<int> local_3ac;
  undefined1 local_3a8 [8];
  DebugComparison<int,_int> _kjCondition_4;
  Builder local_378;
  BuilderFor<short> local_332;
  int local_330;
  bool local_329;
  undefined1 auStack_328 [7];
  bool _kj_shouldLog_3;
  Builder local_318;
  BuilderFor<short> local_2d2;
  int local_2d0;
  DebugExpression<int> local_2cc;
  undefined1 local_2c8 [8];
  DebugComparison<int,_short> _kjCondition_3;
  Builder local_298;
  BuilderFor<signed_char> local_251;
  int local_250;
  bool local_249;
  undefined1 auStack_248 [7];
  bool _kj_shouldLog_2;
  Builder local_238;
  BuilderFor<signed_char> local_1f1;
  int local_1f0;
  DebugExpression<int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<int,_signed_char> _kjCondition_2;
  Builder local_1b8;
  bool local_173;
  bool local_172;
  bool local_171;
  undefined1 auStack_170 [7];
  bool _kj_shouldLog_1;
  Builder local_160;
  bool local_11b;
  bool local_11a;
  DebugExpression<bool> local_119;
  undefined1 local_118 [8];
  DebugComparison<bool,_bool> _kjCondition_1;
  ArrayPtr<const_char> local_f0;
  Builder local_e0;
  Void local_9f;
  bool local_9e;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_90;
  Builder local_80;
  Void local_39;
  Void *local_38;
  undefined1 local_30 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  
  local_38 = (Void *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  kj::StringPtr::StringPtr((StringPtr *)&local_90,"voidField");
  DynamicStruct::Builder::get(&local_80,(Builder *)&stack0x00000008,(StringPtr)local_90);
  DynamicValue::Builder::as<capnp::Void>(&local_80);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,
             (DebugExpression<capnp::Void_const&> *)&local_38,&local_39);
  DynamicValue::Builder::~Builder(&local_80);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    local_9e = kj::_::Debug::shouldLog(ERROR);
    while (local_9e != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_f0,"voidField");
      DynamicStruct::Builder::get(&local_e0,(Builder *)&stack0x00000008,(StringPtr)local_f0);
      DynamicValue::Builder::as<capnp::Void>(&local_e0);
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x158,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, reader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [73])
                  "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,(Void *)&VOID,
                 &local_9f);
      DynamicValue::Builder::~Builder(&local_e0);
      local_9e = false;
    }
  }
  local_11a = true;
  local_119 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_11a);
  kj::StringPtr::StringPtr((StringPtr *)auStack_170,"boolField");
  DynamicStruct::Builder::get(&local_160,(Builder *)&stack0x00000008,(StringPtr)_auStack_170);
  local_11b = DynamicValue::Builder::as<bool>(&local_160);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_118,&local_119,&local_11b);
  DynamicValue::Builder::~Builder(&local_160);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
  if (!bVar1) {
    local_171 = kj::_::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      local_172 = true;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_2.result,"boolField");
      DynamicStruct::Builder::get
                (&local_1b8,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffffe38);
      local_173 = DynamicValue::Builder::as<bool>(&local_1b8);
      kj::_::Debug::log<char_const(&)[73],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, reader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [73])
                  "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
                 (DebugComparison<bool,_bool> *)local_118,&local_172,&local_173);
      DynamicValue::Builder::~Builder(&local_1b8);
      local_171 = false;
    }
  }
  local_1f0 = -0x7b;
  local_1ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_248,"int8Field");
  DynamicStruct::Builder::get(&local_238,(Builder *)&stack0x00000008,(StringPtr)_auStack_248);
  local_1f1 = DynamicValue::Builder::as<signed_char>(&local_238);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_1e8,&local_1ec,&local_1f1);
  DynamicValue::Builder::~Builder(&local_238);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_249 = kj::_::Debug::shouldLog(ERROR);
    while (local_249 != false) {
      local_250 = -0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_3.result,"int8Field");
      DynamicStruct::Builder::get
                (&local_298,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffffd58);
      local_251 = DynamicValue::Builder::as<signed_char>(&local_298);
      kj::_::Debug::log<char_const(&)[75],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -123, reader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [75])
                  "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
                 (DebugComparison<int,_signed_char> *)local_1e8,&local_250,&local_251);
      DynamicValue::Builder::~Builder(&local_298);
      local_249 = false;
    }
  }
  local_2d0 = -0x3039;
  local_2cc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_328,"int16Field");
  DynamicStruct::Builder::get(&local_318,(Builder *)&stack0x00000008,(StringPtr)_auStack_328);
  local_2d2 = DynamicValue::Builder::as<short>(&local_318);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_2c8,&local_2cc,&local_2d2);
  DynamicValue::Builder::~Builder(&local_318);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2c8);
  if (!bVar1) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    while (local_329 != false) {
      local_330 = -0x3039;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_4.result,"int16Field");
      DynamicStruct::Builder::get
                (&local_378,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffffc78);
      local_332 = DynamicValue::Builder::as<short>(&local_378);
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, -12345, reader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [79])
                  "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())"
                 ,(DebugComparison<int,_short> *)local_2c8,&local_330,&local_332);
      DynamicValue::Builder::~Builder(&local_378);
      local_329 = false;
    }
  }
  local_3b0 = -0xbc614e;
  local_3ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3b0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_408,"int32Field");
  DynamicStruct::Builder::get(&local_3f8,(Builder *)&stack0x00000008,(StringPtr)_auStack_408);
  local_3b4 = DynamicValue::Builder::as<int>(&local_3f8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_3a8,&local_3ac,&local_3b4);
  DynamicValue::Builder::~Builder(&local_3f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3a8);
  if (!bVar1) {
    local_409 = kj::_::Debug::shouldLog(ERROR);
    while (local_409 != false) {
      local_410 = -0xbc614e;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_5.result,"int32Field");
      DynamicStruct::Builder::get
                (&local_458,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffffb98);
      local_414 = DynamicValue::Builder::as<int>(&local_458);
      kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -12345678, reader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [82])
                  "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
                 ,(DebugComparison<int,_int> *)local_3a8,&local_410,&local_414);
      DynamicValue::Builder::~Builder(&local_458);
      local_409 = false;
    }
  }
  local_4a0 = -0x7048860ddf79;
  local_498 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4a0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_4f8,"int64Field");
  DynamicStruct::Builder::get(&local_4e8,(Builder *)&stack0x00000008,(StringPtr)_auStack_4f8);
  local_4a8 = DynamicValue::Builder::as<long>(&local_4e8);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_490,&local_498,&local_4a8);
  DynamicValue::Builder::~Builder(&local_4e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
  if (!bVar1) {
    local_4f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f9 != false) {
      local_508 = -0x7048860ddf79;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_6.result,"int64Field");
      DynamicStruct::Builder::get
                (&local_550,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffffaa0);
      local_510 = DynamicValue::Builder::as<long>(&local_550);
      kj::_::Debug::log<char_const(&)[91],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [91])
                  "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
                 ,(DebugComparison<long_long,_long> *)local_490,&local_508,&local_510);
      DynamicValue::Builder::~Builder(&local_550);
      local_4f9 = false;
    }
  }
  local_588 = 0xea;
  local_584 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_588);
  kj::StringPtr::StringPtr((StringPtr *)auStack_5e0,"uInt8Field");
  DynamicStruct::Builder::get(&local_5d0,(Builder *)&stack0x00000008,(StringPtr)_auStack_5e0);
  local_589 = DynamicValue::Builder::as<unsigned_char>(&local_5d0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_580,&local_584,&local_589);
  DynamicValue::Builder::~Builder(&local_5d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_580);
  if (!bVar1) {
    local_5e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e1 != false) {
      local_5e8 = 0xea;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_7.result,"uInt8Field");
      DynamicStruct::Builder::get
                (&local_630,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff9c0);
      local_5e9 = DynamicValue::Builder::as<unsigned_char>(&local_630);
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [77])
                  "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_580,&local_5e8,&local_5e9);
      DynamicValue::Builder::~Builder(&local_630);
      local_5e1 = false;
    }
  }
  local_668 = 0xb26e;
  local_664 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_668);
  kj::StringPtr::StringPtr((StringPtr *)auStack_6c0,"uInt16Field");
  DynamicStruct::Builder::get(&local_6b0,(Builder *)&stack0x00000008,(StringPtr)_auStack_6c0);
  local_66a = DynamicValue::Builder::as<unsigned_short>(&local_6b0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_660,&local_664,&local_66a);
  DynamicValue::Builder::~Builder(&local_6b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_660);
  if (!bVar1) {
    local_6c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6c1 != false) {
      local_6c8 = 0xb26e;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_8.result,"uInt16Field");
      DynamicStruct::Builder::get
                (&local_710,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff8e0);
      local_6ca = DynamicValue::Builder::as<unsigned_short>(&local_710);
      kj::_::Debug::
      log<char_const(&)[81],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [81])
                  "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_short> *)local_660,&local_6c8,&local_6ca);
      DynamicValue::Builder::~Builder(&local_710);
      local_6c1 = false;
    }
  }
  local_748 = 0xce0a6a14;
  local_744 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_748);
  kj::StringPtr::StringPtr((StringPtr *)auStack_7a0,"uInt32Field");
  DynamicStruct::Builder::get(&local_790,(Builder *)&stack0x00000008,(StringPtr)_auStack_7a0);
  local_74c = DynamicValue::Builder::as<unsigned_int>(&local_790);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_740,&local_744,&local_74c);
  DynamicValue::Builder::~Builder(&local_790);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_740);
  if (!bVar1) {
    local_7a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7a1 != false) {
      local_7a8 = 0xce0a6a14;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_9.result,"uInt32Field");
      DynamicStruct::Builder::get
                (&local_7f0,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff800);
      local_7ac = DynamicValue::Builder::as<unsigned_int>(&local_7f0);
      kj::_::Debug::
      log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x160,ERROR,
                 "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [86])
                  "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)local_740,&local_7a8,&local_7ac);
      DynamicValue::Builder::~Builder(&local_7f0);
      local_7a1 = false;
    }
  }
  local_838 = 0xab54a98ceb1f0ad2;
  local_830 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_838);
  kj::StringPtr::StringPtr((StringPtr *)auStack_890,"uInt64Field");
  DynamicStruct::Builder::get(&local_880,(Builder *)&stack0x00000008,(StringPtr)_auStack_890);
  local_840 = DynamicValue::Builder::as<unsigned_long>(&local_880);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_828,&local_830,&local_840);
  DynamicValue::Builder::~Builder(&local_880);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_828);
  if (!bVar1) {
    local_891 = kj::_::Debug::shouldLog(ERROR);
    while (local_891 != false) {
      local_8a0 = 0xab54a98ceb1f0ad2;
      kj::StringPtr::StringPtr((StringPtr *)auStack_8f8,"uInt64Field");
      DynamicStruct::Builder::get(&local_8e8,(Builder *)&stack0x00000008,(StringPtr)_auStack_8f8);
      local_8a8 = DynamicValue::Builder::as<unsigned_long>(&local_8e8);
      kj::_::Debug::
      log<char_const(&)[98],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x161,ERROR,
                 "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [98])
                  "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,(DebugComparison<unsigned_long_long,_unsigned_long> *)local_828,&local_8a0,
                 &local_8a8);
      DynamicValue::Builder::~Builder(&local_8e8);
      local_891 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_950,"float32Field");
  DynamicStruct::Builder::get(&local_940,(Builder *)&stack0x00000008,(StringPtr)_auStack_950);
  BVar2 = DynamicValue::Builder::as<float>(&local_940);
  local_8fa = kj::_::floatAlmostEqual(BVar2,1234.5);
  local_8f9 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8fa);
  DynamicValue::Builder::~Builder(&local_940);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_8f9);
  if (!bVar1) {
    local_951 = kj::_::Debug::shouldLog(ERROR);
    while (local_951 != false) {
      kj::StringPtr::StringPtr((StringPtr *)auStack_9a8,"float32Field");
      DynamicStruct::Builder::get(&local_998,(Builder *)&stack0x00000008,(StringPtr)_auStack_9a8);
      local_958 = DynamicValue::Builder::as<float>(&local_998);
      local_9ac = 1234.5;
      kj::_::Debug::log<char_const(&)[101],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", _kjCondition, reader.get(\"float32Field\").template as<float>(), 1234.5f"
                 ,(char (*) [101])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
                 ,&local_8f9,&local_958,&local_9ac);
      DynamicValue::Builder::~Builder(&local_998);
      local_951 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_a00,"float64Field");
  DynamicStruct::Builder::get(&local_9f0,(Builder *)&stack0x00000008,(StringPtr)_auStack_a00);
  BVar3 = DynamicValue::Builder::as<double>(&local_9f0);
  local_9ae = kj::_::doubleAlmostEqual(BVar3,-1.23e+47);
  local_9ad = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_9ae);
  DynamicValue::Builder::~Builder(&local_9f0);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_9ad);
  if (!bVar1) {
    local_a01 = kj::_::Debug::shouldLog(ERROR);
    while (local_a01 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_a60,"float64Field");
      DynamicStruct::Builder::get(&local_a50,(Builder *)&stack0x00000008,(StringPtr)local_a60);
      local_a10 = DynamicValue::Builder::as<double>(&local_a50);
      _kjCondition_12.result = false;
      _kjCondition_12._49_7_ = 0xc9b58b82c0e0bb;
      kj::_::Debug::log<char_const(&)[103],kj::_::DebugExpression<bool>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", _kjCondition, reader.get(\"float64Field\").template as<double>(), -123e45"
                 ,(char (*) [103])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
                 ,&local_9ad,&local_a10,(double *)&_kjCondition_12.result);
      DynamicValue::Builder::~Builder(&local_a50);
      local_a01 = false;
    }
  }
  local_aa8 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  kj::StringPtr::StringPtr((StringPtr *)auStack_b10,"textField");
  DynamicStruct::Builder::get(&local_b00,(Builder *)&stack0x00000008,(StringPtr)_auStack_b10);
  DynamicValue::Builder::as<capnp::Text>(&local_ac0,&local_b00);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_aa0,
             (DebugExpression<char_const(&)[4]> *)&local_aa8,&local_ac0);
  DynamicValue::Builder::~Builder(&local_b00);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_aa0);
  if (!bVar1) {
    local_b11 = kj::_::Debug::shouldLog(ERROR);
    while (local_b11 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_13.result,"textField");
      DynamicStruct::Builder::get
                (&local_b70,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff480);
      DynamicValue::Builder::as<capnp::Text>(&local_b30,&local_b70);
      kj::_::Debug::
      log<char_const(&)[74],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"foo\", reader.get(\"textField\").template as<Text>()"
                 ,(char (*) [74])
                  "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_aa0,
                 (char (*) [4])"foo",&local_b30);
      DynamicValue::Builder::~Builder(&local_b70);
      local_b11 = false;
    }
  }
  local_bd8 = (ArrayPtr<const_unsigned_char>)_::data("bar");
  local_bc8 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_bd8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_c38,"dataField");
  DynamicStruct::Builder::get(&local_c28,(Builder *)&stack0x00000008,(StringPtr)_auStack_c38);
  local_be8 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_c28);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_bb8,
             (DebugExpression<capnp::Data::Reader> *)&local_bc8,(Builder *)&local_be8);
  DynamicValue::Builder::~Builder(&local_c28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_bb8);
  if (!bVar1) {
    local_c39 = kj::_::Debug::shouldLog(ERROR);
    while (local_c39 != false) {
      local_c50 = (ArrayPtr<const_unsigned_char>)_::data("bar");
      kj::StringPtr::StringPtr((StringPtr *)&subReader.builder.dataSize,"dataField");
      DynamicStruct::Builder::get
                (&local_ca0,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff350);
      AVar4 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_ca0);
      local_c60 = AVar4;
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [80])
                  "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
                 ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_bb8,
                 (Reader *)&local_c50,(Builder *)&local_c60);
      DynamicValue::Builder::~Builder(&local_ca0);
      local_c39 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_14.result,"structField");
  DynamicStruct::Builder::get
            (&local_d20,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff2d0);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_ce0,&local_d20);
  DynamicValue::Builder::~Builder(&local_d20);
  local_d60 = (Void *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  kj::StringPtr::StringPtr((StringPtr *)auStack_db8,"voidField");
  DynamicStruct::Builder::get(&local_da8,(Builder *)local_ce0,(StringPtr)_auStack_db8);
  DynamicValue::Builder::as<capnp::Void>(&local_da8);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_d58,
             (DebugExpression<capnp::Void_const&> *)&local_d60,&local_d61);
  DynamicValue::Builder::~Builder(&local_da8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d58);
  if (!bVar1) {
    local_dba = kj::_::Debug::shouldLog(ERROR);
    while (local_dba != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_e10,"voidField");
      DynamicStruct::Builder::get(&local_e00,(Builder *)local_ce0,(StringPtr)local_e10);
      DynamicValue::Builder::as<capnp::Void>(&local_e00);
      kj::_::Debug::
      log<char_const(&)[76],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x168,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, subReader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [76])
                  "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_d58,(Void *)&VOID,
                 &local_dbb);
      DynamicValue::Builder::~Builder(&local_e00);
      local_dba = false;
    }
  }
  local_e3a = true;
  local_e39 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e3a);
  kj::StringPtr::StringPtr((StringPtr *)auStack_e90,"boolField");
  DynamicStruct::Builder::get(&local_e80,(Builder *)local_ce0,(StringPtr)_auStack_e90);
  local_e3b = DynamicValue::Builder::as<bool>(&local_e80);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_e38,&local_e39,&local_e3b);
  DynamicValue::Builder::~Builder(&local_e80);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e38);
  if (!bVar1) {
    local_e91 = kj::_::Debug::shouldLog(ERROR);
    while (local_e91 != false) {
      local_e92 = true;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_16.result,"boolField");
      DynamicStruct::Builder::get
                (&local_ed8,(Builder *)local_ce0,(StringPtr)stack0xfffffffffffff118);
      local_e93 = DynamicValue::Builder::as<bool>(&local_ed8);
      kj::_::Debug::log<char_const(&)[76],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x169,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, subReader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [76])
                  "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
                 (DebugComparison<bool,_bool> *)local_e38,&local_e92,&local_e93);
      DynamicValue::Builder::~Builder(&local_ed8);
      local_e91 = false;
    }
  }
  local_f10 = -0xc;
  local_f0c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f10);
  kj::StringPtr::StringPtr((StringPtr *)auStack_f68,"int8Field");
  DynamicStruct::Builder::get(&local_f58,(Builder *)local_ce0,(StringPtr)_auStack_f68);
  local_f11 = DynamicValue::Builder::as<signed_char>(&local_f58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_f08,&local_f0c,&local_f11);
  DynamicValue::Builder::~Builder(&local_f58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f08);
  if (!bVar1) {
    local_f69 = kj::_::Debug::shouldLog(ERROR);
    while (local_f69 != false) {
      local_f70 = -0xc;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_17.result,"int8Field");
      DynamicStruct::Builder::get
                (&local_fb8,(Builder *)local_ce0,(StringPtr)stack0xfffffffffffff038);
      local_f71 = DynamicValue::Builder::as<signed_char>(&local_fb8);
      kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16a,ERROR,
                 "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -12, subReader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [77])
                  "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
                 (DebugComparison<int,_signed_char> *)local_f08,&local_f70,&local_f71);
      DynamicValue::Builder::~Builder(&local_fb8);
      local_f69 = false;
    }
  }
  local_ff0 = 0xd80;
  local_fec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ff0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1048,"int16Field");
  DynamicStruct::Builder::get(&local_1038,(Builder *)local_ce0,(StringPtr)_auStack_1048);
  local_ff2 = DynamicValue::Builder::as<short>(&local_1038);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_fe8,&local_fec,&local_ff2);
  DynamicValue::Builder::~Builder(&local_1038);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_fe8);
  if (!bVar1) {
    local_1049 = kj::_::Debug::shouldLog(ERROR);
    while (local_1049 != false) {
      local_1050 = 0xd80;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_18.result,"int16Field");
      DynamicStruct::Builder::get
                (&local_1098,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffef58);
      local_1052 = DynamicValue::Builder::as<short>(&local_1098);
      kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16b,ERROR,
                 "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, 3456, subReader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [80])
                  "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())"
                 ,(DebugComparison<int,_short> *)local_fe8,&local_1050,&local_1052);
      DynamicValue::Builder::~Builder(&local_1098);
      local_1049 = false;
    }
  }
  local_10d0 = -0x4b3eff2;
  local_10cc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_10d0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1128,"int32Field");
  DynamicStruct::Builder::get(&local_1118,(Builder *)local_ce0,(StringPtr)_auStack_1128);
  local_10d4 = DynamicValue::Builder::as<int>(&local_1118);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_10c8,&local_10cc,&local_10d4);
  DynamicValue::Builder::~Builder(&local_1118);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_10c8);
  if (!bVar1) {
    local_1129 = kj::_::Debug::shouldLog(ERROR);
    while (local_1129 != false) {
      local_1130 = -0x4b3eff2;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_19.result,"int32Field");
      DynamicStruct::Builder::get
                (&local_1178,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffee78);
      local_1134 = DynamicValue::Builder::as<int>(&local_1178);
      kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [85])
                  "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
                 ,(DebugComparison<int,_int> *)local_10c8,&local_1130,&local_1134);
      DynamicValue::Builder::~Builder(&local_1178);
      local_1129 = false;
    }
  }
  local_11c0 = 0x33a638e8734e;
  local_11b8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_11c0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1218,"int64Field");
  DynamicStruct::Builder::get(&local_1208,(Builder *)local_ce0,(StringPtr)_auStack_1218);
  local_11c8 = DynamicValue::Builder::as<long>(&local_1208);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_11b0,&local_11b8,&local_11c8);
  DynamicValue::Builder::~Builder(&local_1208);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_11b0);
  if (!bVar1) {
    local_1219 = kj::_::Debug::shouldLog(ERROR);
    while (local_1219 != false) {
      local_1228 = 0x33a638e8734e;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_20.result,"int64Field");
      DynamicStruct::Builder::get
                (&local_1270,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffed80);
      local_1230 = DynamicValue::Builder::as<long>(&local_1270);
      kj::_::Debug::log<char_const(&)[92],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [92])
                  "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
                 ,(DebugComparison<long_long,_long> *)local_11b0,&local_1228,&local_1230);
      DynamicValue::Builder::~Builder(&local_1270);
      local_1219 = false;
    }
  }
  local_12a8 = 0x5a;
  local_12a4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1300,"uInt8Field");
  DynamicStruct::Builder::get(&local_12f0,(Builder *)local_ce0,(StringPtr)_auStack_1300);
  local_12a9 = DynamicValue::Builder::as<unsigned_char>(&local_12f0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_12a0,&local_12a4,&local_12a9);
  DynamicValue::Builder::~Builder(&local_12f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_12a0);
  if (!bVar1) {
    local_1301 = kj::_::Debug::shouldLog(ERROR);
    while (local_1301 != false) {
      local_1308 = 0x5a;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_21.result,"uInt8Field");
      DynamicStruct::Builder::get
                (&local_1350,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffeca0);
      local_1309 = DynamicValue::Builder::as<unsigned_char>(&local_1350);
      kj::_::Debug::
      log<char_const(&)[79],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [79])
                  "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_char> *)local_12a0,&local_1308,&local_1309
                );
      DynamicValue::Builder::~Builder(&local_1350);
      local_1301 = false;
    }
  }
  local_1388 = 0x4d2;
  local_1384 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1388);
  kj::StringPtr::StringPtr((StringPtr *)auStack_13e0,"uInt16Field");
  DynamicStruct::Builder::get(&local_13d0,(Builder *)local_ce0,(StringPtr)_auStack_13e0);
  local_138a = DynamicValue::Builder::as<unsigned_short>(&local_13d0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1380,&local_1384,&local_138a);
  DynamicValue::Builder::~Builder(&local_13d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1380);
  if (!bVar1) {
    local_13e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_13e1 != false) {
      local_13e8 = 0x4d2;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_22.result,"uInt16Field");
      DynamicStruct::Builder::get
                (&local_1430,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffebc0);
      local_13ea = DynamicValue::Builder::as<unsigned_short>(&local_1430);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [83])
                  "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_short> *)local_1380,&local_13e8,
                 &local_13ea);
      DynamicValue::Builder::~Builder(&local_1430);
      local_13e1 = false;
    }
  }
  local_1468 = 0x3628814;
  local_1464 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1468);
  kj::StringPtr::StringPtr((StringPtr *)auStack_14c0,"uInt32Field");
  DynamicStruct::Builder::get(&local_14b0,(Builder *)local_ce0,(StringPtr)_auStack_14c0);
  local_146c = DynamicValue::Builder::as<unsigned_int>(&local_14b0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1460,&local_1464,&local_146c);
  DynamicValue::Builder::~Builder(&local_14b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1460);
  if (!bVar1) {
    local_14c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_14c1 != false) {
      local_14c8 = 0x3628814;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_23.result,"uInt32Field");
      DynamicStruct::Builder::get
                (&local_1510,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffeae0);
      local_14cc = DynamicValue::Builder::as<unsigned_int>(&local_1510);
      kj::_::Debug::
      log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x170,ERROR,
                 "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [87])
                  "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)local_1460,&local_14c8,&local_14cc)
      ;
      DynamicValue::Builder::~Builder(&local_1510);
      local_14c1 = false;
    }
  }
  local_1558 = 0x4cc1921126f0ad2;
  local_1550 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1558);
  kj::StringPtr::StringPtr((StringPtr *)auStack_15b0,"uInt64Field");
  DynamicStruct::Builder::get(&local_15a0,(Builder *)local_ce0,(StringPtr)_auStack_15b0);
  local_1560 = DynamicValue::Builder::as<unsigned_long>(&local_15a0);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_1548,&local_1550,
             &local_1560);
  DynamicValue::Builder::~Builder(&local_15a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1548);
  if (!bVar1) {
    local_15b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_15b1 != false) {
      local_15c0 = 0x4cc1921126f0ad2;
      kj::StringPtr::StringPtr((StringPtr *)auStack_1618,"uInt64Field");
      DynamicStruct::Builder::get(&local_1608,(Builder *)local_ce0,(StringPtr)_auStack_1618);
      local_15c8 = DynamicValue::Builder::as<unsigned_long>(&local_1608);
      kj::_::Debug::
      log<char_const(&)[99],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x171,ERROR,
                 "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [99])
                  "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,(DebugComparison<unsigned_long_long,_unsigned_long> *)local_1548,&local_15c0,
                 &local_15c8);
      DynamicValue::Builder::~Builder(&local_1608);
      local_15b1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1670,"float32Field");
  DynamicStruct::Builder::get(&local_1660,(Builder *)local_ce0,(StringPtr)_auStack_1670);
  BVar2 = DynamicValue::Builder::as<float>(&local_1660);
  local_161a = kj::_::floatAlmostEqual(BVar2,-1.25e-10);
  local_1619 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_161a);
  DynamicValue::Builder::~Builder(&local_1660);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1619);
  if (!bVar1) {
    local_1671 = kj::_::Debug::shouldLog(ERROR);
    while (local_1671 != false) {
      kj::StringPtr::StringPtr((StringPtr *)auStack_16c8,"float32Field");
      DynamicStruct::Builder::get(&local_16b8,(Builder *)local_ce0,(StringPtr)_auStack_16c8);
      local_1678 = DynamicValue::Builder::as<float>(&local_16b8);
      local_16cc = -1.25e-10;
      kj::_::Debug::log<char_const(&)[107],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", _kjCondition, subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
                 ,(char (*) [107])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
                 ,&local_1619,&local_1678,&local_16cc);
      DynamicValue::Builder::~Builder(&local_16b8);
      local_1671 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1720,"float64Field");
  DynamicStruct::Builder::get(&local_1710,(Builder *)local_ce0,(StringPtr)_auStack_1720);
  BVar3 = DynamicValue::Builder::as<double>(&local_1710);
  local_16ce = kj::_::doubleAlmostEqual(BVar3,345.0);
  local_16cd = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_16ce);
  DynamicValue::Builder::~Builder(&local_1710);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_16cd);
  if (!bVar1) {
    local_1721 = kj::_::Debug::shouldLog(ERROR);
    while (local_1721 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1780,"float64Field");
      DynamicStruct::Builder::get(&local_1770,(Builder *)local_ce0,(StringPtr)local_1780);
      local_1730 = DynamicValue::Builder::as<double>(&local_1770);
      _kjCondition_26._52_4_ = 0x159;
      kj::_::Debug::log<char_const(&)[102],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x173,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", _kjCondition, subReader.get(\"float64Field\").template as<double>(), 345"
                 ,(char (*) [102])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
                 ,&local_16cd,&local_1730,(int *)&_kjCondition_26.field_0x34);
      DynamicValue::Builder::~Builder(&local_1770);
      local_1721 = false;
    }
  }
  local_17c8 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0xa0bef3);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1830,"textField");
  DynamicStruct::Builder::get(&local_1820,(Builder *)local_ce0,(StringPtr)_auStack_1830);
  DynamicValue::Builder::as<capnp::Text>(&local_17e0,&local_1820);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_17c0,
             (DebugExpression<char_const(&)[4]> *)&local_17c8,&local_17e0);
  DynamicValue::Builder::~Builder(&local_1820);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17c0);
  if (!bVar1) {
    local_1831 = kj::_::Debug::shouldLog(ERROR);
    while (local_1831 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_27.result,"textField");
      DynamicStruct::Builder::get
                (&local_1890,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffe760);
      DynamicValue::Builder::as<capnp::Text>(&local_1850,&local_1890);
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x174,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"baz\", subReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [77])
                  "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_17c0,
                 (char (*) [4])0xa0bef3,&local_1850);
      DynamicValue::Builder::~Builder(&local_1890);
      local_1831 = false;
    }
  }
  local_18f8 = (ArrayPtr<const_unsigned_char>)_::data("qux");
  local_18e8 = (ArrayPtr<const_unsigned_char>)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_18f8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1958,"dataField");
  DynamicStruct::Builder::get(&local_1948,(Builder *)local_ce0,(StringPtr)_auStack_1958);
  local_1908 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_1948);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_18d8,
             (DebugExpression<capnp::Data::Reader> *)&local_18e8,(Builder *)&local_1908);
  DynamicValue::Builder::~Builder(&local_1948);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18d8);
  if (!bVar1) {
    local_1959 = kj::_::Debug::shouldLog(ERROR);
    while (local_1959 != false) {
      local_1970 = (ArrayPtr<const_unsigned_char>)_::data("qux");
      kj::StringPtr::StringPtr((StringPtr *)&subSubReader.builder.dataSize,"dataField");
      DynamicStruct::Builder::get
                (&local_19c0,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffe630);
      AVar4 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_19c0);
      local_1980 = AVar4;
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x175,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [83])
                  "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
                 ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_18d8,
                 (Reader *)&local_1970,(Builder *)&local_1980);
      DynamicValue::Builder::~Builder(&local_19c0);
      local_1959 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_28.result,"structField");
  DynamicStruct::Builder::get(&local_1a40,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffe5b0);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_1a00,&local_1a40);
  DynamicValue::Builder::~Builder(&local_1a40);
  local_1a90 = (char (*) [7])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [7])0x9f8950);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1af8,"textField");
  DynamicStruct::Builder::get(&local_1ae8,(Builder *)local_1a00,(StringPtr)_auStack_1af8);
  DynamicValue::Builder::as<capnp::Text>(&local_1aa8,&local_1ae8);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_1a88,
             (DebugExpression<char_const(&)[7]> *)&local_1a90,&local_1aa8);
  DynamicValue::Builder::~Builder(&local_1ae8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a88);
  if (!bVar1) {
    local_1af9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1af9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_29.result,"textField");
      DynamicStruct::Builder::get
                (&local_1b58,(Builder *)local_1a00,(StringPtr)stack0xffffffffffffe498);
      DynamicValue::Builder::as<capnp::Text>(&local_1b18,&local_1b58);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Builder>&,char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x178,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"nested\", subSubReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [83])
                  "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_1a88,
                 (char (*) [7])0x9f8950,&local_1b18);
      DynamicValue::Builder::~Builder(&local_1b58);
      local_1af9 = false;
    }
  }
  local_1ba8 = (char (*) [14])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (char (*) [14])"really nested");
  kj::StringPtr::StringPtr((StringPtr *)&local_1c80,"structField");
  DynamicStruct::Builder::get(&local_1c70,(Builder *)local_1a00,(StringPtr)local_1c80);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1c30,&local_1c70);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1c90,"textField");
  DynamicStruct::Builder::get(&local_1c00,&local_1c30,(StringPtr)_auStack_1c90);
  DynamicValue::Builder::as<capnp::Text>(&local_1bc0,&local_1c00);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            ((DebugComparison<const_char_(&)[14],_capnp::Text::Builder> *)local_1ba0,
             (DebugExpression<char_const(&)[14]> *)&local_1ba8,&local_1bc0);
  DynamicValue::Builder::~Builder(&local_1c00);
  DynamicValue::Builder::~Builder(&local_1c70);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1ba0);
  if (!bVar1) {
    local_1c91 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c91 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1d70,"structField");
      DynamicStruct::Builder::get(&local_1d60,(Builder *)local_1a00,(StringPtr)local_1d70);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1d20,&local_1d60);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_30.result,"textField");
      DynamicStruct::Builder::get(&local_1cf0,&local_1d20,(StringPtr)stack0xffffffffffffe280);
      DynamicValue::Builder::as<capnp::Text>(&local_1cb0,&local_1cf0);
      kj::_::Debug::
      log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Builder>&,char_const(&)[14],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x17a,ERROR,
                 "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
                 ,(char (*) [139])
                  "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[14],_capnp::Text::Builder> *)local_1ba0,
                 (char (*) [14])"really nested",&local_1cb0);
      DynamicValue::Builder::~Builder(&local_1cf0);
      DynamicValue::Builder::~Builder(&local_1d60);
      local_1c91 = false;
    }
  }
  local_1db8 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0xa0bef3);
  kj::StringPtr::StringPtr((StringPtr *)&local_1e28,"enumField");
  DynamicStruct::Builder::get(&local_1e18,(Builder *)local_ce0,(StringPtr)local_1e28);
  BVar5 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_1e18);
  e._8_8_ = BVar5._8_8_;
  SStack_1e38.raw = (RawBrandedSchema *)BVar5.schema.super_Schema.raw;
  local_1e30 = BVar5.value;
  local_1dd0 = CONCAT22(local_1dd0._2_2_,local_1e30);
  e.schema.super_Schema.raw._4_4_ = 0;
  e.schema.super_Schema.raw._0_4_ = local_1dd0;
  local_1dd8.raw = SStack_1e38.raw;
  local_1dc8 = (ArrayPtr<const_char>)anon_unknown_134::name((anon_unknown_134 *)SStack_1e38.raw,e);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1db0,
             (DebugExpression<char_const(&)[4]> *)&local_1db8,(Reader *)&local_1dc8);
  DynamicValue::Builder::~Builder(&local_1e18);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1db0);
  if (!bVar1) {
    local_1e39 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e39 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1eb0,"enumField");
      DynamicStruct::Builder::get(&local_1ea0,(Builder *)local_ce0,(StringPtr)local_1eb0);
      BVar5 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_1ea0);
      e_00._8_8_ = BVar5._8_8_;
      local_1ec0.raw = (RawBrandedSchema *)BVar5.schema.super_Schema.raw;
      local_1eb8 = BVar5.value;
      local_1e58 = CONCAT22(local_1e58._2_2_,local_1eb8);
      e_00.schema.super_Schema.raw._4_4_ = 0;
      e_00.schema.super_Schema.raw._0_4_ = local_1e58;
      local_1e60.raw = local_1ec0.raw;
      AVar6 = (ArrayPtr<const_char>)anon_unknown_134::name((anon_unknown_134 *)local_1ec0.raw,e_00);
      local_1e50 = AVar6;
      kj::_::Debug::
      log<char_const(&)[90],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", _kjCondition, \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [90])
                  "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1db0,
                 (char (*) [4])0xa0bef3,(Reader *)&local_1e50);
      DynamicValue::Builder::~Builder(&local_1ea0);
      local_1e39 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_1f10,"voidList");
  name_23.content.size_ = local_1f10.content.size_;
  name_23.content.ptr = local_1f10.content.ptr;
  DynamicStruct::Builder::get(&local_1f00,(Builder *)local_ce0,name_23);
  local_1f23._3_8_ = local_1f23;
  local_1f23._11_8_ = 3;
  expected._M_len = local_1f10.content.size_;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Builder>
            ((_ *)&local_1f00,(Builder *)local_1f23._3_8_,expected);
  DynamicValue::Builder::~Builder(&local_1f00);
  kj::StringPtr::StringPtr(&local_1f78,"boolList");
  name_22.content.size_ = local_1f78.content.size_;
  name_22.content.ptr = local_1f78.content.ptr;
  DynamicStruct::Builder::get(&local_1f68,(Builder *)local_ce0,name_22);
  local_1f8d[0] = UNKNOWN;
  local_1f8d[1] = 1;
  local_1f8d[2] = UNKNOWN >> 0x10;
  local_1f8d[3] = 1;
  local_1f8d[4] = 1;
  local_1f8d._5_8_ = local_1f8d;
  local_1f8d._13_8_ = 5;
  expected_00._M_len = local_1f78.content.size_;
  expected_00._M_array = (iterator)0x5;
  checkList<bool,capnp::DynamicValue::Builder>
            ((_ *)&local_1f68,(Builder *)local_1f8d._5_8_,expected_00);
  DynamicValue::Builder::~Builder(&local_1f68);
  kj::StringPtr::StringPtr(&local_1fe0,"int8List");
  name_21.content.size_ = local_1fe0.content.size_;
  name_21.content.ptr = local_1fe0.content.ptr;
  DynamicStruct::Builder::get(&local_1fd0,(Builder *)local_ce0,name_21);
  local_1ff4[0] = ANY_POINTER;
  local_1ff4[1] = 0xde;
  local_1ff4[2] = 0x80;
  local_1ff4[3] = 0x7f;
  local_1ff4._4_8_ = local_1ff4;
  local_1ff4._12_8_ = 4;
  expected_01._M_len = local_1fe0.content.size_;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_1fd0,(Builder *)local_1ff4._4_8_,expected_01);
  DynamicValue::Builder::~Builder(&local_1fd0);
  kj::StringPtr::StringPtr((StringPtr *)(local_2060 + 0x18),"int16List");
  name_20.content.size_ = local_2060._32_8_;
  name_20.content.ptr = (char *)local_2060._24_8_;
  DynamicStruct::Builder::get(&local_2038,(Builder *)local_ce0,name_20);
  local_2060._0_2_ = 0x4d2;
  local_2060._2_2_ = 0xe9d2;
  local_2060._4_2_ = 0x8000;
  local_2060._6_2_ = 0x7fff;
  local_2060._8_8_ = local_2060;
  local_2060._16_8_ = 4;
  expected_02._M_len = local_2060._32_8_;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Builder>
            ((_ *)&local_2038,(Builder *)local_2060._8_8_,expected_02);
  DynamicValue::Builder::~Builder(&local_2038);
  kj::StringPtr::StringPtr((StringPtr *)(local_20d0 + 0x20),"int32List");
  name_19.content.size_ = local_20d0._40_8_;
  name_19.content.ptr = (char *)local_20d0._32_8_;
  DynamicStruct::Builder::get(&local_20a0,(Builder *)local_ce0,name_19);
  local_20d0._0_4_ = 0xbc614e;
  local_20d0._4_4_ = 0xfaa0d340;
  local_20d0._8_4_ = 0x80000000;
  local_20d0._12_4_ = 0x7fffffff;
  local_20d0._16_8_ = local_20d0;
  local_20d0._24_8_ = 4;
  expected_03._M_len = local_20d0._40_8_;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Builder>
            ((_ *)&local_20a0,(Builder *)local_20d0._16_8_,expected_03);
  DynamicValue::Builder::~Builder(&local_20a0);
  kj::StringPtr::StringPtr((StringPtr *)(local_2158 + 0x38),"int64List");
  name_18.content.size_ = local_2118;
  name_18.content.ptr = (char *)local_2158._56_8_;
  DynamicStruct::Builder::get(&local_2110,(Builder *)local_ce0,name_18);
  local_2158._16_8_ = 0x8000000000000000;
  local_2158._24_8_ = 0x7fffffffffffffff;
  local_2158._0_8_ = 0x7048860ddf79;
  local_2158._8_8_ = (uchar *)0xfffd968afd13752e;
  local_2158._40_8_ = local_2158;
  local_2158._48_8_ = 4;
  expected_04._M_len = local_2118;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Builder>
            ((_ *)&local_2110,(Builder *)local_2158._40_8_,expected_04);
  DynamicValue::Builder::~Builder(&local_2110);
  kj::StringPtr::StringPtr(&local_21a8,"uInt8List");
  name_17.content.size_ = local_21a8.content.size_;
  name_17.content.ptr = local_21a8.content.ptr;
  DynamicStruct::Builder::get(&local_2198,(Builder *)local_ce0,name_17);
  local_21bc[0] = ANY_POINTER;
  local_21bc[1] = 0x22;
  local_21bc[2] = UNKNOWN >> 0x10;
  local_21bc[3] = 0xff;
  local_21bc._4_8_ = local_21bc;
  local_21bc._12_8_ = 4;
  expected_05._M_len = local_21a8.content.size_;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_2198,(Builder *)local_21bc._4_8_,expected_05);
  DynamicValue::Builder::~Builder(&local_2198);
  kj::StringPtr::StringPtr((StringPtr *)(local_2228 + 0x18),"uInt16List");
  name_16.content.size_ = local_2228._32_8_;
  name_16.content.ptr = (char *)local_2228._24_8_;
  DynamicStruct::Builder::get(&local_2200,(Builder *)local_ce0,name_16);
  local_2228._0_2_ = 0x4d2;
  local_2228._2_2_ = 0x162e;
  local_2228._4_2_ = 0;
  local_2228._6_2_ = 0xffff;
  local_2228._8_8_ = local_2228;
  local_2228._16_8_ = 4;
  expected_06._M_len = local_2228._32_8_;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_2200,(Builder *)local_2228._8_8_,expected_06);
  DynamicValue::Builder::~Builder(&local_2200);
  kj::StringPtr::StringPtr((StringPtr *)(local_2298 + 0x20),"uInt32List");
  name_15.content.size_ = local_2298._40_8_;
  name_15.content.ptr = (char *)local_2298._32_8_;
  DynamicStruct::Builder::get(&local_2268,(Builder *)local_ce0,name_15);
  local_2298._0_4_ = 0xbc614e;
  local_2298._4_4_ = 0x55f2cc0;
  local_2298._8_4_ = 0;
  local_2298._12_4_ = 0xffffffff;
  local_2298._16_8_ = local_2298;
  local_2298._24_8_ = 4;
  expected_07._M_len = local_2298._40_8_;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_2268,(Builder *)local_2298._16_8_,expected_07);
  DynamicValue::Builder::~Builder(&local_2268);
  kj::StringPtr::StringPtr((StringPtr *)(local_2318 + 0x30),"uInt64List");
  name_14.content.size_ = local_2318._56_8_;
  name_14.content.ptr = (char *)local_2318._48_8_;
  DynamicStruct::Builder::get(&local_22d8,(Builder *)local_ce0,name_14);
  local_2318._16_8_ = (char *)0x0;
  local_2318._24_8_ = 0xffffffffffffffff;
  local_2318._0_8_ = 0x7048860ddf79;
  local_2318._8_8_ = 3.35421776919204e-309;
  local_2318._32_8_ = local_2318;
  local_2318._40_8_ = (byte *)0x4;
  expected_08._M_len = local_2318._56_8_;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_22d8,(Builder *)local_2318._32_8_,expected_08);
  DynamicValue::Builder::~Builder(&local_22d8);
  kj::StringPtr::StringPtr((StringPtr *)(local_2398 + 0x30),"float32List");
  name_13.content.size_ = local_2398._56_8_;
  name_13.content.ptr = (char *)local_2398._48_8_;
  DynamicStruct::Builder::get(&local_2358,(Builder *)local_ce0,name_13);
  local_2398._16_8_ = (char *)0x82081cea02081cea;
  local_2398._0_8_ = 0x4996b43800000000;
  local_2398._8_8_ = (uchar *)0xfcf0bdc27cf0bdc2;
  local_2398._32_8_ = local_2398;
  local_2398._40_8_ = (byte *)0x6;
  expected_09._M_len = local_2398._56_8_;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Builder>
            ((_ *)&local_2358,(Builder *)local_2398._32_8_,expected_09);
  DynamicValue::Builder::~Builder(&local_2358);
  kj::StringPtr::StringPtr(&local_23e8,"float64List");
  name_12.content.size_ = local_23e8.content.size_;
  name_12.content.ptr = local_23e8.content.ptr;
  DynamicStruct::Builder::get(&local_23d8,(Builder *)local_ce0,name_12);
  local_2428.field_1.listValue.builder.capTable = (CapTableBuilder *)0x66789e3750f791;
  local_2428.field_1.listValue.builder.ptr = (byte *)0x8066789e3750f791;
  local_2428.field_1.textValue.content.ptr = (char *)0x7f76c8e5ca239029;
  local_2428.field_1.listValue.builder.segment = (SegmentBuilder *)0xff76c8e5ca239029;
  local_2428.type = UNKNOWN;
  local_2428._4_4_ = 0;
  local_2428.field_1.dataValue.super_ArrayPtr<unsigned_char>.ptr = (uchar *)0x42dc12218377de40;
  local_2428.field_1._40_8_ = &local_2428;
  local_2428.field_1._48_8_ = 6;
  expected_10._M_len = local_23e8.content.size_;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Builder>
            ((_ *)&local_23d8,(Builder *)local_2428.field_1._40_8_,expected_10);
  DynamicValue::Builder::~Builder(&local_23d8);
  kj::StringPtr::StringPtr(&local_2478,"textList");
  name_11.content.size_ = local_2478.content.size_;
  name_11.content.ptr = local_2478.content.ptr;
  DynamicStruct::Builder::get(&local_2468,(Builder *)local_ce0,name_11);
  Text::Reader::Reader((Reader *)local_24b8,"quux");
  Text::Reader::Reader((Reader *)(local_24b8 + 0x10),"corge");
  Text::Reader::Reader(local_2498,"grault");
  local_2498[1].super_StringPtr.content.ptr = local_24b8;
  local_2498[1].super_StringPtr.content.size_ = 3;
  expected_11._M_len = local_2478.content.size_;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_2468,(Builder *)local_2498[1].super_StringPtr.content.ptr,expected_11);
  DynamicValue::Builder::~Builder(&local_2468);
  kj::StringPtr::StringPtr((StringPtr *)&local_2508,"dataList");
  DynamicStruct::Builder::get(&local_24f8,(Builder *)local_ce0,(StringPtr)local_2508);
  RVar7 = _::data("garply");
  listReader.builder._32_8_ = RVar7.super_ArrayPtr<const_unsigned_char>.ptr;
  _::data("waldo");
  RVar7 = _::data("fred");
  expected_12._M_len = RVar7.super_ArrayPtr<const_unsigned_char>.size_;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_24f8,(Builder *)&listReader.builder.structDataSize,expected_12);
  DynamicValue::Builder::~Builder(&local_24f8);
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_31.result,"structList");
  DynamicStruct::Builder::get(&local_25c0,(Builder *)local_ce0,(StringPtr)stack0xffffffffffffda30);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_2580,&local_25c0);
  DynamicValue::Builder::~Builder(&local_25c0);
  local_25f8 = 3;
  local_25f4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_25f8);
  f.exception._4_4_ = DynamicList::Builder::size((Builder *)local_2580);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_25f0,&local_25f4,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_25f0);
  if (!bVar1) {
    _kjCondition_32._52_4_ = 3;
    _kjCondition_32._48_4_ = DynamicList::Builder::size((Builder *)local_2580);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_2608,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,399,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_25f0,
               (uint *)&_kjCondition_32.field_0x34,(uint *)&_kjCondition_32.result);
    kj::_::Debug::Fault::fatal(&local_2608);
  }
  local_2650 = (char (*) [15])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (char (*) [15])"x structlist 1");
  DynamicList::Builder::operator[](&local_2718,(Builder *)local_2580,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_26d8,&local_2718);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2728,"textField");
  DynamicStruct::Builder::get(&local_26a8,&local_26d8,(StringPtr)_auStack_2728);
  DynamicValue::Builder::as<capnp::Text>(&local_2668,&local_26a8);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_2648,
             (DebugExpression<char_const(&)[15]> *)&local_2650,&local_2668);
  DynamicValue::Builder::~Builder(&local_26a8);
  DynamicValue::Builder::~Builder(&local_2718);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2648);
  if (!bVar1) {
    local_2729 = kj::_::Debug::shouldLog(ERROR);
    while (local_2729 != false) {
      DynamicList::Builder::operator[](&local_27f8,(Builder *)local_2580,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_27b8,&local_27f8);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_33.result,"textField");
      DynamicStruct::Builder::get(&local_2788,&local_27b8,(StringPtr)stack0xffffffffffffd7f8);
      DynamicValue::Builder::as<capnp::Text>(&local_2748,&local_2788);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_2648,
                 (char (*) [15])"x structlist 1",&local_2748);
      DynamicValue::Builder::~Builder(&local_2788);
      DynamicValue::Builder::~Builder(&local_27f8);
      local_2729 = false;
    }
  }
  local_2848 = (char (*) [15])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (char (*) [15])"x structlist 2");
  DynamicList::Builder::operator[](&local_2910,(Builder *)local_2580,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_28d0,&local_2910);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2920,"textField");
  DynamicStruct::Builder::get(&local_28a0,&local_28d0,(StringPtr)_auStack_2920);
  DynamicValue::Builder::as<capnp::Text>(&local_2860,&local_28a0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_2840,
             (DebugExpression<char_const(&)[15]> *)&local_2848,&local_2860);
  DynamicValue::Builder::~Builder(&local_28a0);
  DynamicValue::Builder::~Builder(&local_2910);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2840);
  if (!bVar1) {
    local_2921 = kj::_::Debug::shouldLog(ERROR);
    while (local_2921 != false) {
      DynamicList::Builder::operator[](&local_29f0,(Builder *)local_2580,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_29b0,&local_29f0);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_34.result,"textField");
      DynamicStruct::Builder::get(&local_2980,&local_29b0,(StringPtr)stack0xffffffffffffd600);
      DynamicValue::Builder::as<capnp::Text>(&local_2940,&local_2980);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x191,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_2840,
                 (char (*) [15])"x structlist 2",&local_2940);
      DynamicValue::Builder::~Builder(&local_2980);
      DynamicValue::Builder::~Builder(&local_29f0);
      local_2921 = false;
    }
  }
  local_2a40 = (char (*) [15])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (char (*) [15])"x structlist 3");
  DynamicList::Builder::operator[](&local_2b08,(Builder *)local_2580,2);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2ac8,&local_2b08);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2b18,"textField");
  DynamicStruct::Builder::get(&local_2a98,&local_2ac8,(StringPtr)_auStack_2b18);
  DynamicValue::Builder::as<capnp::Text>(&local_2a58,&local_2a98);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_2a38,
             (DebugExpression<char_const(&)[15]> *)&local_2a40,&local_2a58);
  DynamicValue::Builder::~Builder(&local_2a98);
  DynamicValue::Builder::~Builder(&local_2b08);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a38);
  if (!bVar1) {
    local_2b19 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b19 != false) {
      DynamicList::Builder::operator[](&local_2be8,(Builder *)local_2580,2);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2ba8,&local_2be8);
      kj::StringPtr::StringPtr((StringPtr *)&local_2bf8,"textField");
      DynamicStruct::Builder::get(&local_2b78,&local_2ba8,(StringPtr)local_2bf8);
      DynamicValue::Builder::as<capnp::Text>(&local_2b38,&local_2b78);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_2a38,
                 (char (*) [15])"x structlist 3",&local_2b38);
      DynamicValue::Builder::~Builder(&local_2b78);
      DynamicValue::Builder::~Builder(&local_2be8);
      local_2b19 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_2c48,"enumList");
  name_10.content.size_ = local_2c48.content.size_;
  name_10.content.ptr = local_2c48.content.ptr;
  DynamicStruct::Builder::get(&local_2c38,(Builder *)local_ce0,name_10);
  _kjCondition_35._40_8_ = (long)"[foo, (bar, baz)] qux" + 0x12;
  expected_13._M_len = local_2c48.content.size_;
  expected_13._M_array = (iterator)0x3;
  checkEnumList<capnp::DynamicValue::Builder>
            ((anon_unknown_134 *)&local_2c38,(Builder *)&_kjCondition_35.result,expected_13);
  DynamicValue::Builder::~Builder(&local_2c38);
  local_2cb0 = (char (*) [6])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [6])"corge");
  kj::StringPtr::StringPtr((StringPtr *)&local_2d20,"enumField");
  DynamicStruct::Builder::get(&local_2d10,(Builder *)&stack0x00000008,(StringPtr)local_2d20);
  BVar5 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_2d10);
  e_01._8_8_ = BVar5._8_8_;
  SStack_2d30.raw = (RawBrandedSchema *)BVar5.schema.super_Schema.raw;
  local_2d28 = BVar5.value;
  local_2cc8 = CONCAT22(local_2cc8._2_2_,local_2d28);
  e_01.schema.super_Schema.raw._4_4_ = 0;
  e_01.schema.super_Schema.raw._0_4_ = local_2cc8;
  local_2cd0.raw = SStack_2d30.raw;
  local_2cc0 = (ArrayPtr<const_char>)
               anon_unknown_134::name((anon_unknown_134 *)SStack_2d30.raw,e_01);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_2ca8,
             (DebugExpression<char_const(&)[6]> *)&local_2cb0,(Reader *)&local_2cc0);
  DynamicValue::Builder::~Builder(&local_2d10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2ca8);
  if (!bVar1) {
    local_2d31 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d31 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_2da8,"enumField");
      DynamicStruct::Builder::get(&local_2d98,(Builder *)&stack0x00000008,(StringPtr)local_2da8);
      BVar5 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_2d98);
      e_02._8_8_ = BVar5._8_8_;
      _kjCondition_36._24_8_ = BVar5.schema.super_Schema.raw;
      local_2d50 = CONCAT22(local_2d50._2_2_,BVar5.value);
      e_02.schema.super_Schema.raw._4_4_ = 0;
      e_02.schema.super_Schema.raw._0_4_ = local_2d50;
      local_2d58.raw = (RawBrandedSchema *)_kjCondition_36._24_8_;
      AVar6 = (ArrayPtr<const_char>)
              anon_unknown_134::name((anon_unknown_134 *)_kjCondition_36._24_8_,e_02);
      local_2d48 = AVar6;
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x196,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", _kjCondition, \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [89])
                  "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_2ca8,
                 (char (*) [6])"corge",(Reader *)&local_2d48);
      DynamicValue::Builder::~Builder(&local_2d98);
      local_2d31 = false;
    }
  }
  local_2de0 = 6;
  local_2ddc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2de0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2e70,"voidList");
  DynamicStruct::Builder::get(&local_2e60,(Builder *)&stack0x00000008,(StringPtr)_auStack_2e70);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_2e20,&local_2e60);
  local_2de4 = DynamicList::Builder::size(&local_2e20);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_2dd8,&local_2ddc,&local_2de4);
  DynamicValue::Builder::~Builder(&local_2e60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2dd8);
  if (!bVar1) {
    local_2e71 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e71 != false) {
      local_2e78 = 6;
      kj::StringPtr::StringPtr((StringPtr *)&local_2f08,"voidList");
      DynamicStruct::Builder::get(&local_2ef8,(Builder *)&stack0x00000008,(StringPtr)local_2f08);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2eb8,&local_2ef8);
      local_2e7c = DynamicList::Builder::size(&local_2eb8);
      kj::_::Debug::
      log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", _kjCondition, 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)local_2dd8,&local_2e78,&local_2e7c)
      ;
      DynamicValue::Builder::~Builder(&local_2ef8);
      local_2e71 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_2f58,"boolList");
  name_09.content.size_ = local_2f58.content.size_;
  name_09.content.ptr = local_2f58.content.ptr;
  DynamicStruct::Builder::get(&local_2f48,(Builder *)&stack0x00000008,name_09);
  local_2f6c[0] = VOID;
  local_2f6c[1] = UNKNOWN >> 8;
  local_2f6c[2] = UNKNOWN >> 0x10;
  local_2f6c[3] = 1;
  local_2f6c._4_8_ = local_2f6c;
  local_2f6c._12_8_ = 4;
  expected_14._M_len = local_2f58.content.size_;
  expected_14._M_array = (iterator)0x4;
  checkList<bool,capnp::DynamicValue::Builder>
            ((_ *)&local_2f48,(Builder *)local_2f6c._4_8_,expected_14);
  DynamicValue::Builder::~Builder(&local_2f48);
  kj::StringPtr::StringPtr(&local_2fc0,"int8List");
  name_08.content.size_ = local_2fc0.content.size_;
  name_08.content.ptr = local_2fc0.content.ptr;
  DynamicStruct::Builder::get(&local_2fb0,(Builder *)&stack0x00000008,name_08);
  local_2fd2[0] = 0x6f;
  local_2fd2[1] = 0x91;
  local_2fd2._2_8_ = local_2fd2;
  local_2fd2._10_8_ = 2;
  expected_15._M_len = local_2fc0.content.size_;
  expected_15._M_array = (iterator)0x2;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_2fb0,(Builder *)local_2fd2._2_8_,expected_15);
  DynamicValue::Builder::~Builder(&local_2fb0);
  kj::StringPtr::StringPtr(&local_3028,"int16List");
  name_07.content.size_ = local_3028.content.size_;
  name_07.content.ptr = local_3028.content.ptr;
  DynamicStruct::Builder::get(&local_3018,(Builder *)&stack0x00000008,name_07);
  local_303c._0_2_ = 0x2b67;
  local_303c._2_2_ = 0xd499;
  local_303c._4_8_ = local_303c;
  local_303c._12_8_ = 2;
  expected_16._M_len = local_3028.content.size_;
  expected_16._M_array = (iterator)0x2;
  checkList<short,capnp::DynamicValue::Builder>
            ((_ *)&local_3018,(Builder *)local_303c._4_8_,expected_16);
  DynamicValue::Builder::~Builder(&local_3018);
  kj::StringPtr::StringPtr((StringPtr *)(local_30a8 + 0x18),"int32List");
  name_06.content.size_ = local_30a8._32_8_;
  name_06.content.ptr = (char *)local_30a8._24_8_;
  DynamicStruct::Builder::get(&local_3080,(Builder *)&stack0x00000008,name_06);
  local_30a8._0_4_ = 0x69f6bc7;
  local_30a8._4_4_ = 0xf9609439;
  local_30a8._8_8_ = local_30a8;
  local_30a8._16_8_ = 2;
  expected_17._M_len = local_30a8._32_8_;
  expected_17._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Builder>
            ((_ *)&local_3080,(Builder *)local_30a8._8_8_,expected_17);
  DynamicValue::Builder::~Builder(&local_3080);
  kj::StringPtr::StringPtr((StringPtr *)(local_3118 + 0x20),"int64List");
  name_05.content.size_ = local_3118._40_8_;
  name_05.content.ptr = (char *)local_3118._32_8_;
  DynamicStruct::Builder::get(&local_30e8,(Builder *)&stack0x00000008,name_05);
  local_3118._0_8_ = 0xf6b75ab2bc471c7;
  local_3118._8_8_ = (uchar *)0xf0948a54d43b8e39;
  local_3118._16_8_ = local_3118;
  local_3118._24_8_ = 2;
  expected_18._M_len = local_3118._40_8_;
  expected_18._M_array = (iterator)0x2;
  checkList<long,capnp::DynamicValue::Builder>
            ((_ *)&local_30e8,(Builder *)local_3118._16_8_,expected_18);
  DynamicValue::Builder::~Builder(&local_30e8);
  kj::StringPtr::StringPtr(&local_3168,"uInt8List");
  name_04.content.size_ = local_3168.content.size_;
  name_04.content.ptr = local_3168.content.ptr;
  DynamicStruct::Builder::get(&local_3158,(Builder *)&stack0x00000008,name_04);
  local_317a[0] = 0x6f;
  local_317a[1] = 0xde;
  local_317a._2_8_ = local_317a;
  local_317a._10_8_ = 2;
  expected_19._M_len = local_3168.content.size_;
  expected_19._M_array = (iterator)0x2;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_3158,(Builder *)local_317a._2_8_,expected_19);
  DynamicValue::Builder::~Builder(&local_3158);
  kj::StringPtr::StringPtr(&local_31d0,"uInt16List");
  name_03.content.size_ = local_31d0.content.size_;
  name_03.content.ptr = local_31d0.content.ptr;
  DynamicStruct::Builder::get(&local_31c0,(Builder *)&stack0x00000008,name_03);
  local_31e4._0_2_ = 0x8235;
  local_31e4._2_2_ = 0xad9c;
  local_31e4._4_8_ = local_31e4;
  local_31e4._12_8_ = 2;
  expected_20._M_len = local_31d0.content.size_;
  expected_20._M_array = (iterator)0x2;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_31c0,(Builder *)local_31e4._4_8_,expected_20);
  DynamicValue::Builder::~Builder(&local_31c0);
  kj::StringPtr::StringPtr(&local_3238,"uInt32List");
  name_02.content.size_ = local_3238.content.size_;
  name_02.content.ptr = local_3238.content.ptr;
  DynamicStruct::Builder::get(&local_3228,(Builder *)&stack0x00000008,name_02);
  local_324c._0_4_ = 0xc6aea155;
  local_324c._4_8_ = local_324c;
  local_324c._12_8_ = 1;
  expected_21._M_len = local_3238.content.size_;
  expected_21._M_array = (iterator)0x1;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_3228,(Builder *)local_324c._4_8_,expected_21);
  DynamicValue::Builder::~Builder(&local_3228);
  kj::StringPtr::StringPtr(&local_32a0,"uInt64List");
  name_01.content.size_ = local_32a0.content.size_;
  name_01.content.ptr = local_32a0.content.ptr;
  DynamicStruct::Builder::get(&local_3290,(Builder *)&stack0x00000008,name_01);
  listReader_1.builder.structDataSize = 0xb5ac71c7;
  listReader_1.builder.structPointerCount = 0x98af;
  listReader_1.builder.elementSize = 0x32;
  listReader_1.builder._39_1_ = 0x9a;
  expected_22._M_len = local_32a0.content.size_;
  expected_22._M_array = (iterator)0x1;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_3290,(Builder *)&listReader_1.builder.structDataSize,expected_22);
  DynamicValue::Builder::~Builder(&local_3290);
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_37.result,"float32List");
  DynamicStruct::Builder::get
            (&local_3330,(Builder *)&stack0x00000008,(StringPtr)stack0xffffffffffffccc0);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_32f0,&local_3330);
  DynamicValue::Builder::~Builder(&local_3330);
  local_3368 = 4;
  local_3364 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3368);
  f_1.exception._4_4_ = DynamicList::Builder::size((Builder *)local_32f0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_3360,&local_3364,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3360);
  if (!bVar1) {
    _kjCondition_38._28_4_ = 4;
    _kjCondition_38._24_4_ = DynamicList::Builder::size((Builder *)local_32f0);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_3378,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a4,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_3360,
               (uint *)&_kjCondition_38.field_0x1c,(uint *)&_kjCondition_38.result);
    kj::_::Debug::Fault::fatal(&local_3378);
  }
  local_33a8 = 5555.5;
  local_33a4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_33a8);
  DynamicList::Builder::operator[]((Builder *)local_33f0,(Builder *)local_32f0,0);
  local_33ac = DynamicValue::Builder::as<float>((Builder *)local_33f0);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_33a0,&local_33a4,&local_33ac);
  DynamicValue::Builder::~Builder((Builder *)local_33f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_33a0);
  if (!bVar1) {
    local_33f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_33f1 != false) {
      local_33f8 = 5555.5;
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_39.result,(Builder *)local_32f0,0);
      local_33fc = DynamicValue::Builder::as<float>((Builder *)&_kjCondition_39.result);
      kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a5,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", _kjCondition, 5555.5f, listReader[0].template as<float>()"
                 ,(char (*) [67])
                  "failed: expected (5555.5f) == (listReader[0].template as<float>())",
                 (DebugComparison<float,_float> *)local_33a0,&local_33f8,&local_33fc);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_39.result);
      local_33f1 = false;
    }
  }
  local_3468 = kj::inf();
  local_3464 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3468);
  DynamicList::Builder::operator[]((Builder *)local_34b0,(Builder *)local_32f0,1);
  local_346c = DynamicValue::Builder::as<float>((Builder *)local_34b0);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_3460,&local_3464,&local_346c);
  DynamicValue::Builder::~Builder((Builder *)local_34b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3460);
  if (!bVar1) {
    local_34b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_34b1 != false) {
      local_34b8 = kj::inf();
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_40.result,(Builder *)local_32f0,1);
      local_34bc = DynamicValue::Builder::as<float>((Builder *)&_kjCondition_40.result);
      kj::_::Debug::log<char_const(&)[69],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a6,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", _kjCondition, kj::inf(), listReader[1].template as<float>()"
                 ,(char (*) [69])
                  "failed: expected (kj::inf()) == (listReader[1].template as<float>())",
                 (DebugComparison<float,_float> *)local_3460,&local_34b8,&local_34bc);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_40.result);
      local_34b1 = false;
    }
  }
  local_3528 = kj::inf();
  local_3528 = -local_3528;
  local_3524 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3528);
  DynamicList::Builder::operator[]((Builder *)local_3570,(Builder *)local_32f0,2);
  local_352c = DynamicValue::Builder::as<float>((Builder *)local_3570);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_3520,&local_3524,&local_352c);
  DynamicValue::Builder::~Builder((Builder *)local_3570);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3520);
  if (!bVar1) {
    local_3571 = kj::_::Debug::shouldLog(ERROR);
    while (local_3571 != false) {
      local_3578 = kj::inf();
      local_3578 = -local_3578;
      DynamicList::Builder::operator[]((Builder *)local_35c0,(Builder *)local_32f0,2);
      local_357c = DynamicValue::Builder::as<float>((Builder *)local_35c0);
      kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a7,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", _kjCondition, -kj::inf(), listReader[2].template as<float>()"
                 ,(char (*) [70])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
                 (DebugComparison<float,_float> *)local_3520,&local_3578,&local_357c);
      DynamicValue::Builder::~Builder((Builder *)local_35c0);
      local_3571 = false;
    }
  }
  DynamicList::Builder::operator[]((Builder *)local_3608,(Builder *)local_32f0,3);
  BVar2 = DynamicValue::Builder::as<float>((Builder *)local_3608);
  local_35c2 = isNaN(BVar2);
  local_35c1 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_35c2);
  DynamicValue::Builder::~Builder((Builder *)local_3608);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_35c1);
  if (!bVar1) {
    listReader_2.builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (listReader_2.builder._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a8,ERROR,
                 "\"failed: expected \" \"isNaN(listReader[3].template as<float>())\", _kjCondition"
                 ,(char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())",
                 &local_35c1);
      listReader_2.builder._39_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_42.result,"float64List");
  DynamicStruct::Builder::get
            (&local_3688,(Builder *)&stack0x00000008,(StringPtr)stack0xffffffffffffc968);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_3648,&local_3688);
  DynamicValue::Builder::~Builder(&local_3688);
  local_36c0 = 4;
  local_36bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_36c0);
  f_2.exception._4_4_ = DynamicList::Builder::size((Builder *)local_3648);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_36b8,&local_36bc,
             (uint *)((long)&f_2.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_36b8);
  if (!bVar1) {
    _kjCondition_43._36_4_ = 4;
    _kjCondition_43._32_4_ = DynamicList::Builder::size((Builder *)local_3648);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_36d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ac,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_36b8,
               (uint *)&_kjCondition_43.field_0x24,(uint *)&_kjCondition_43.result);
    kj::_::Debug::Fault::fatal(&local_36d0);
  }
  local_3710 = 7777.75;
  local_3708 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3710);
  DynamicList::Builder::operator[]((Builder *)local_3758,(Builder *)local_3648,0);
  local_3718 = DynamicValue::Builder::as<double>((Builder *)local_3758);
  kj::_::DebugExpression<double>::operator==
            ((DebugComparison<double,_double> *)local_3700,&local_3708,&local_3718);
  DynamicValue::Builder::~Builder((Builder *)local_3758);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3700);
  if (!bVar1) {
    local_3759 = kj::_::Debug::shouldLog(ERROR);
    while (local_3759 != false) {
      local_3768 = 7777.75;
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_44.result,(Builder *)local_3648,0);
      local_3770 = DynamicValue::Builder::as<double>((Builder *)&_kjCondition_44.result);
      kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<double,double>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ad,ERROR,
                 "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", _kjCondition, 7777.75, listReader[0].template as<double>()"
                 ,(char (*) [68])
                  "failed: expected (7777.75) == (listReader[0].template as<double>())",
                 (DebugComparison<double,_double> *)local_3700,&local_3768,&local_3770);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_44.result);
      local_3759 = false;
    }
  }
  local_37e0 = kj::inf();
  local_37dc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_37e0);
  DynamicList::Builder::operator[]((Builder *)local_3828,(Builder *)local_3648,1);
  local_37e8 = DynamicValue::Builder::as<double>((Builder *)local_3828);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_double> *)local_37d8,&local_37dc,&local_37e8);
  DynamicValue::Builder::~Builder((Builder *)local_3828);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_37d8);
  if (!bVar1) {
    local_3829 = kj::_::Debug::shouldLog(ERROR);
    while (local_3829 != false) {
      local_3830 = kj::inf();
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_45.result,(Builder *)local_3648,1);
      local_3838 = DynamicValue::Builder::as<double>((Builder *)&_kjCondition_45.result);
      kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<float,double>&,float,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ae,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", _kjCondition, kj::inf(), listReader[1].template as<double>()"
                 ,(char (*) [70])
                  "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
                 (DebugComparison<float,_double> *)local_37d8,&local_3830,&local_3838);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_45.result);
      local_3829 = false;
    }
  }
  local_38a8 = kj::inf();
  local_38a8 = -local_38a8;
  local_38a4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38a8);
  DynamicList::Builder::operator[]((Builder *)local_38f0,(Builder *)local_3648,2);
  local_38b0 = DynamicValue::Builder::as<double>((Builder *)local_38f0);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_double> *)local_38a0,&local_38a4,&local_38b0);
  DynamicValue::Builder::~Builder((Builder *)local_38f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38a0);
  if (!bVar1) {
    local_38f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_38f1 != false) {
      local_38f8 = kj::inf();
      local_38f8 = -local_38f8;
      DynamicList::Builder::operator[]((Builder *)local_3940,(Builder *)local_3648,2);
      local_3900 = DynamicValue::Builder::as<double>((Builder *)local_3940);
      kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<float,double>&,float,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1af,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", _kjCondition, -kj::inf(), listReader[2].template as<double>()"
                 ,(char (*) [71])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
                 (DebugComparison<float,_double> *)local_38a0,&local_38f8,&local_3900);
      DynamicValue::Builder::~Builder((Builder *)local_3940);
      local_38f1 = false;
    }
  }
  DynamicList::Builder::operator[]((Builder *)local_3988,(Builder *)local_3648,3);
  BVar3 = DynamicValue::Builder::as<double>((Builder *)local_3988);
  local_3942 = isNaN(BVar3);
  local_3941 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3942);
  DynamicValue::Builder::~Builder((Builder *)local_3988);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_3941);
  if (!bVar1) {
    local_3989 = kj::_::Debug::shouldLog(ERROR);
    while (local_3989 != false) {
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b0,ERROR,
                 "\"failed: expected \" \"isNaN(listReader[3].template as<double>())\", _kjCondition"
                 ,(char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())",
                 &local_3941);
      local_3989 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_39e0,"textList");
  name_00.content.size_ = local_39e0.content.size_;
  name_00.content.ptr = local_39e0.content.ptr;
  DynamicStruct::Builder::get(&local_39d0,(Builder *)&stack0x00000008,name_00);
  Text::Reader::Reader((Reader *)local_3a20,"plugh");
  Text::Reader::Reader((Reader *)(local_3a20 + 0x10),"xyzzy");
  Text::Reader::Reader(local_3a00,"thud");
  local_3a00[1].super_StringPtr.content.ptr = local_3a20;
  local_3a00[1].super_StringPtr.content.size_ = 3;
  expected_23._M_len = local_39e0.content.size_;
  expected_23._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_39d0,(Builder *)local_3a00[1].super_StringPtr.content.ptr,expected_23);
  DynamicValue::Builder::~Builder(&local_39d0);
  kj::StringPtr::StringPtr((StringPtr *)&local_3a70,"dataList");
  DynamicStruct::Builder::get(&local_3a60,(Builder *)&stack0x00000008,(StringPtr)local_3a70);
  RVar7 = _::data("oops");
  listReader_3.builder._32_8_ = RVar7.super_ArrayPtr<const_unsigned_char>.ptr;
  _::data("exhausted");
  RVar7 = _::data("rfc3092");
  expected_24._M_len = RVar7.super_ArrayPtr<const_unsigned_char>.size_;
  expected_24._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_3a60,(Builder *)&listReader_3.builder.structDataSize,expected_24);
  DynamicValue::Builder::~Builder(&local_3a60);
  kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_47.result,"structList");
  DynamicStruct::Builder::get
            (&local_3b28,(Builder *)&stack0x00000008,(StringPtr)stack0xffffffffffffc4c8);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_3ae8,&local_3b28);
  DynamicValue::Builder::~Builder(&local_3b28);
  local_3b60 = 3;
  local_3b5c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3b60);
  f_3.exception._4_4_ = DynamicList::Builder::size((Builder *)local_3ae8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_3b58,&local_3b5c,
             (uint *)((long)&f_3.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b58);
  if (bVar1) {
    local_3bb8 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9f89d8);
    DynamicList::Builder::operator[](&local_3c80,(Builder *)local_3ae8,0);
    DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3c40,&local_3c80);
    kj::StringPtr::StringPtr((StringPtr *)auStack_3c90,"textField");
    DynamicStruct::Builder::get(&local_3c10,&local_3c40,(StringPtr)_auStack_3c90);
    DynamicValue::Builder::as<capnp::Text>(&local_3bd0,&local_3c10);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_3bb0,
               (DebugExpression<char_const(&)[13]> *)&local_3bb8,&local_3bd0);
    DynamicValue::Builder::~Builder(&local_3c10);
    DynamicValue::Builder::~Builder(&local_3c80);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3bb0);
    if (!bVar1) {
      local_3c91 = kj::_::Debug::shouldLog(ERROR);
      while (local_3c91 != false) {
        DynamicList::Builder::operator[](&local_3d60,(Builder *)local_3ae8,0);
        DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3d20,&local_3d60);
        kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_49.result,"textField");
        DynamicStruct::Builder::get(&local_3cf0,&local_3d20,(StringPtr)stack0xffffffffffffc290);
        DynamicValue::Builder::as<capnp::Text>(&local_3cb0,&local_3cf0);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b7,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_3bb0,
                   (char (*) [13])0x9f89d8,&local_3cb0);
        DynamicValue::Builder::~Builder(&local_3cf0);
        DynamicValue::Builder::~Builder(&local_3d60);
        local_3c91 = false;
      }
    }
    local_3db0 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9f89e7);
    DynamicList::Builder::operator[](&local_3e78,(Builder *)local_3ae8,1);
    DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3e38,&local_3e78);
    kj::StringPtr::StringPtr((StringPtr *)auStack_3e88,"textField");
    DynamicStruct::Builder::get(&local_3e08,&local_3e38,(StringPtr)_auStack_3e88);
    DynamicValue::Builder::as<capnp::Text>(&local_3dc8,&local_3e08);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_3da8,
               (DebugExpression<char_const(&)[13]> *)&local_3db0,&local_3dc8);
    DynamicValue::Builder::~Builder(&local_3e08);
    DynamicValue::Builder::~Builder(&local_3e78);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3da8);
    if (!bVar1) {
      local_3e89 = kj::_::Debug::shouldLog(ERROR);
      while (local_3e89 != false) {
        DynamicList::Builder::operator[](&local_3f58,(Builder *)local_3ae8,1);
        DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3f18,&local_3f58);
        kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_50.result,"textField");
        DynamicStruct::Builder::get(&local_3ee8,&local_3f18,(StringPtr)stack0xffffffffffffc098);
        DynamicValue::Builder::as<capnp::Text>(&local_3ea8,&local_3ee8);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b8,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_3da8,
                   (char (*) [13])0x9f89e7,&local_3ea8);
        DynamicValue::Builder::~Builder(&local_3ee8);
        DynamicValue::Builder::~Builder(&local_3f58);
        local_3e89 = false;
      }
    }
    local_3fa8 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9f89f6);
    DynamicList::Builder::operator[](&local_4070,(Builder *)local_3ae8,2);
    DynamicValue::Builder::as<capnp::DynamicStruct>(&local_4030,&local_4070);
    kj::StringPtr::StringPtr((StringPtr *)auStack_4080,"textField");
    DynamicStruct::Builder::get(&local_4000,&local_4030,(StringPtr)_auStack_4080);
    DynamicValue::Builder::as<capnp::Text>(&local_3fc0,&local_4000);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_3fa0,
               (DebugExpression<char_const(&)[13]> *)&local_3fa8,&local_3fc0);
    DynamicValue::Builder::~Builder(&local_4000);
    DynamicValue::Builder::~Builder(&local_4070);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3fa0);
    if (!bVar1) {
      local_4081 = kj::_::Debug::shouldLog(ERROR);
      while (local_4081 != false) {
        DynamicList::Builder::operator[](&local_4150,(Builder *)local_3ae8,2);
        DynamicValue::Builder::as<capnp::DynamicStruct>(&local_4110,&local_4150);
        kj::StringPtr::StringPtr((StringPtr *)&local_4160,"textField");
        DynamicStruct::Builder::get(&local_40e0,&local_4110,(StringPtr)local_4160);
        DynamicValue::Builder::as<capnp::Text>(&local_40a0,&local_40e0);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b9,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_3fa0,
                   (char (*) [13])0x9f89f6,&local_40a0);
        DynamicValue::Builder::~Builder(&local_40e0);
        DynamicValue::Builder::~Builder(&local_4150);
        local_4081 = false;
      }
    }
    kj::StringPtr::StringPtr((StringPtr *)(local_41c8 + 0x18),"enumList");
    name.content.size_ = local_41c8._32_8_;
    name.content.ptr = (char *)local_41c8._24_8_;
    DynamicStruct::Builder::get(&local_41a0,(Builder *)&stack0x00000008,name);
    local_41d0 = "foo";
    local_41c8._0_8_ = (long)"foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply" + 0x2a;
    local_41c8._8_8_ = &local_41d0;
    local_41c8._16_8_ = 2;
    expected_25._M_len = local_41c8._32_8_;
    expected_25._M_array = (iterator)0x2;
    checkEnumList<capnp::DynamicValue::Builder>
              ((anon_unknown_134 *)&local_41a0,(Builder *)local_41c8._8_8_,expected_25);
    DynamicValue::Builder::~Builder(&local_41a0);
    return;
  }
  _kjCondition_48._52_4_ = 3;
  _kjCondition_48._48_4_ = DynamicList::Builder::size((Builder *)local_3ae8);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_3b70,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x1b6,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_3b58,
             (uint *)&_kjCondition_48.field_0x34,(uint *)&_kjCondition_48.result);
  kj::_::Debug::Fault::fatal(&local_3b70);
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}